

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  BBox1f BVar3;
  RTCIntersectArguments RVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  __m256 afVar10;
  float fVar11;
  float fVar12;
  size_t k;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  bool bVar72;
  int iVar73;
  uint uVar74;
  AABBNodeMB4D *node1;
  ulong uVar75;
  RTCIntersectArguments *pRVar76;
  long lVar77;
  undefined1 (*pauVar78) [32];
  ulong uVar79;
  RTCIntersectArguments *pRVar80;
  long lVar81;
  ulong uVar82;
  undefined4 uVar83;
  RTCIntersectArguments *unaff_R12;
  uint uVar84;
  NodeRef root;
  ulong *puVar85;
  float fVar86;
  float fVar93;
  float fVar94;
  undefined1 auVar87 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar88 [32];
  float fVar95;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar99;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar112;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar114;
  float fVar116;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 in_ZMM1 [64];
  undefined1 auVar110 [64];
  undefined1 extraout_var [56];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar139;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar162;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar190 [64];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar198 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 in_ZMM13 [64];
  float fVar201;
  undefined1 auVar202 [32];
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 in_ZMM14 [64];
  undefined1 auVar203 [64];
  undefined1 auVar209 [32];
  Precalculations pre;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  vbool<8> terminated;
  Vec3<embree::vfloat_impl<8>_> p0;
  TravRayK<8,_true> tray;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> u;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2dc1;
  RTCIntersectArguments *local_2dc0;
  ulong local_2db8;
  RTCIntersectArguments *local_2db0;
  ulong local_2da8;
  undefined1 local_2da0 [32];
  RTCFilterFunctionNArguments local_2d80;
  RTCIntersectArguments *local_2d48;
  undefined1 local_2d40 [32];
  undefined1 local_2d20 [32];
  BVH *local_2d00;
  Intersectors *local_2cf8;
  RTCIntersectArguments *local_2cf0;
  ulong local_2ce8;
  float local_2ce0 [4];
  float fStack_2cd0;
  float fStack_2ccc;
  float fStack_2cc8;
  float fStack_2cc4;
  float local_2cc0 [4];
  float fStack_2cb0;
  float fStack_2cac;
  float fStack_2ca8;
  float local_2ca0 [4];
  float fStack_2c90;
  float fStack_2c8c;
  float fStack_2c88;
  undefined4 uStack_2c84;
  undefined1 local_2c80 [32];
  undefined1 local_2c60 [32];
  undefined1 local_2c40 [32];
  undefined1 local_2c20 [32];
  undefined1 local_2c00 [32];
  undefined1 local_2be0 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2bc0;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [32];
  uint local_2b00;
  uint uStack_2afc;
  uint uStack_2af8;
  uint uStack_2af4;
  uint uStack_2af0;
  uint uStack_2aec;
  uint uStack_2ae8;
  uint uStack_2ae4;
  uint local_2ae0;
  uint uStack_2adc;
  uint uStack_2ad8;
  uint uStack_2ad4;
  uint uStack_2ad0;
  uint uStack_2acc;
  uint uStack_2ac8;
  uint uStack_2ac4;
  uint local_2ac0;
  uint uStack_2abc;
  uint uStack_2ab8;
  uint uStack_2ab4;
  uint uStack_2ab0;
  uint uStack_2aac;
  uint uStack_2aa8;
  uint uStack_2aa4;
  undefined1 local_2aa0 [32];
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 local_2a70;
  undefined8 uStack_2a68;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2a60;
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [8];
  float fStack_2958;
  float fStack_2954;
  float fStack_2950;
  float fStack_294c;
  float fStack_2948;
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2880;
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  undefined1 local_27c0 [8];
  float fStack_27b8;
  float fStack_27b4;
  float fStack_27b0;
  float fStack_27ac;
  float fStack_27a8;
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  float local_2760;
  float fStack_275c;
  float fStack_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  float fStack_2748;
  undefined4 uStack_2744;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined4 local_1e80;
  undefined4 uStack_1e7c;
  undefined4 uStack_1e78;
  undefined4 uStack_1e74;
  undefined4 uStack_1e70;
  undefined4 uStack_1e6c;
  undefined4 uStack_1e68;
  undefined4 uStack_1e64;
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar111 [64];
  float fVar113;
  float fVar115;
  float fVar117;
  undefined1 auVar171 [64];
  undefined1 auVar197 [64];
  
  local_2608 = (((BVH *)This->ptr)->root).ptr;
  if (local_2608 != 8) {
    auVar132 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar121 = ZEXT816(0) << 0x40;
    auVar100 = vpcmpeqd_avx2(auVar132,(undefined1  [32])valid_i->field_0);
    auVar132 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar121),5);
    auVar105 = auVar100 & auVar132;
    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar105 >> 0x7f,0) != '\0') ||
          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar105 >> 0xbf,0) != '\0') ||
        (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar105[0x1f] < '\0') {
      auVar132 = vandps_avx(auVar132,auVar100);
      auVar87 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
      local_2a60._0_8_ = *(undefined8 *)ray;
      local_2a60._8_8_ = *(undefined8 *)(ray + 8);
      local_2a60._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2a60._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2a60._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2a60._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2a60._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2a60._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2a60._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2a60._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2a60._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2a60._88_8_ = *(undefined8 *)(ray + 0x58);
      local_2a00 = *(undefined1 (*) [32])(ray + 0x80);
      local_29e0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_29c0 = *(undefined1 (*) [32])(ray + 0xc0);
      local_27a0._8_4_ = 0x7fffffff;
      local_27a0._0_8_ = 0x7fffffff7fffffff;
      local_27a0._12_4_ = 0x7fffffff;
      local_27a0._16_4_ = 0x7fffffff;
      local_27a0._20_4_ = 0x7fffffff;
      local_27a0._24_4_ = 0x7fffffff;
      local_27a0._28_4_ = 0x7fffffff;
      auVar190 = ZEXT3264(local_27a0);
      auVar104._8_4_ = 0x219392ef;
      auVar104._0_8_ = 0x219392ef219392ef;
      auVar104._12_4_ = 0x219392ef;
      auVar104._16_4_ = 0x219392ef;
      auVar104._20_4_ = 0x219392ef;
      auVar104._24_4_ = 0x219392ef;
      auVar104._28_4_ = 0x219392ef;
      auVar195._8_4_ = 0x3f800000;
      auVar195._0_8_ = 0x3f8000003f800000;
      auVar195._12_4_ = 0x3f800000;
      auVar195._16_4_ = 0x3f800000;
      auVar195._20_4_ = 0x3f800000;
      auVar195._24_4_ = 0x3f800000;
      auVar195._28_4_ = 0x3f800000;
      auVar197 = ZEXT3264(auVar195);
      auVar130 = vdivps_avx(auVar195,local_2a00);
      auVar132 = vandps_avx(local_27a0,local_2a00);
      auVar105 = vcmpps_avx(auVar132,auVar104,1);
      auVar132 = vandps_avx(local_27a0,local_29e0);
      auVar100 = vcmpps_avx(auVar132,auVar104,1);
      auVar131 = vdivps_avx(auVar195,local_29e0);
      auVar132 = vandps_avx(local_27a0,local_29c0);
      auVar132 = vcmpps_avx(auVar132,auVar104,1);
      auVar140 = vdivps_avx(auVar195,local_29c0);
      auVar187._8_4_ = 0x5d5e0b6b;
      auVar187._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar187._12_4_ = 0x5d5e0b6b;
      auVar187._16_4_ = 0x5d5e0b6b;
      auVar187._20_4_ = 0x5d5e0b6b;
      auVar187._24_4_ = 0x5d5e0b6b;
      auVar187._28_4_ = 0x5d5e0b6b;
      local_29a0 = vblendvps_avx(auVar130,auVar187,auVar105);
      local_2980 = vblendvps_avx(auVar131,auVar187,auVar100);
      _local_2960 = vblendvps_avx(auVar140,auVar187,auVar132);
      auVar132 = vcmpps_avx(local_29a0,ZEXT1632(auVar121),1);
      auVar105._8_4_ = 0x10;
      auVar105._0_8_ = 0x1000000010;
      auVar105._12_4_ = 0x10;
      auVar105._16_4_ = 0x10;
      auVar105._20_4_ = 0x10;
      auVar105._24_4_ = 0x10;
      auVar105._28_4_ = 0x10;
      local_2940 = vandps_avx(auVar132,auVar105);
      auVar130._8_4_ = 0x20;
      auVar130._0_8_ = 0x2000000020;
      auVar130._12_4_ = 0x20;
      auVar130._16_4_ = 0x20;
      auVar130._20_4_ = 0x20;
      auVar130._24_4_ = 0x20;
      auVar130._28_4_ = 0x20;
      auVar163._8_4_ = 0x30;
      auVar163._0_8_ = 0x3000000030;
      auVar163._12_4_ = 0x30;
      auVar163._16_4_ = 0x30;
      auVar163._20_4_ = 0x30;
      auVar163._24_4_ = 0x30;
      auVar163._28_4_ = 0x30;
      auVar171 = ZEXT3264(auVar163);
      auVar105 = ZEXT1632(auVar121);
      auVar132 = vcmpps_avx(local_2980,auVar105,5);
      local_2920 = vblendvps_avx(auVar163,auVar130,auVar132);
      auVar131._8_4_ = 0x40;
      auVar131._0_8_ = 0x4000000040;
      auVar131._12_4_ = 0x40;
      auVar131._16_4_ = 0x40;
      auVar131._20_4_ = 0x40;
      auVar131._24_4_ = 0x40;
      auVar131._28_4_ = 0x40;
      auVar140._8_4_ = 0x50;
      auVar140._0_8_ = 0x5000000050;
      auVar140._12_4_ = 0x50;
      auVar140._16_4_ = 0x50;
      auVar140._20_4_ = 0x50;
      auVar140._24_4_ = 0x50;
      auVar140._28_4_ = 0x50;
      auVar132 = vcmpps_avx(_local_2960,auVar105,5);
      local_2900 = vblendvps_avx(auVar140,auVar131,auVar132);
      auVar132 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar105);
      auVar105 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar105);
      local_28a0 = vpmovsxwd_avx2(auVar87);
      auVar100._8_4_ = 0x7f800000;
      auVar100._0_8_ = 0x7f8000007f800000;
      auVar100._12_4_ = 0x7f800000;
      auVar100._16_4_ = 0x7f800000;
      auVar100._20_4_ = 0x7f800000;
      auVar100._24_4_ = 0x7f800000;
      auVar100._28_4_ = 0x7f800000;
      local_28e0 = vblendvps_avx(auVar100,auVar132,local_28a0);
      auVar132._8_4_ = 0xff800000;
      auVar132._0_8_ = 0xff800000ff800000;
      auVar132._12_4_ = 0xff800000;
      auVar132._16_4_ = 0xff800000;
      auVar132._20_4_ = 0xff800000;
      auVar132._24_4_ = 0xff800000;
      auVar132._28_4_ = 0xff800000;
      local_28c0 = vblendvps_avx(auVar132,auVar105,local_28a0);
      auVar121 = vpcmpeqd_avx(local_28c0._0_16_,local_28c0._0_16_);
      local_2c80 = vpmovsxwd_avx2(auVar87 ^ auVar121);
      local_2cf8 = This;
      local_2d00 = (BVH *)This->ptr;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar82 = 5;
      }
      else {
        uVar82 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2d48 = (RTCIntersectArguments *)(ray + 0x100);
      puVar85 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar78 = (undefined1 (*) [32])local_1e40;
      local_1e80 = 0x7f800000;
      uStack_1e7c = 0x7f800000;
      uStack_1e78 = 0x7f800000;
      uStack_1e74 = 0x7f800000;
      uStack_1e70 = 0x7f800000;
      uStack_1e6c = 0x7f800000;
      uStack_1e68 = 0x7f800000;
      uStack_1e64 = 0x7f800000;
      local_1e60 = local_28e0;
      local_2db8 = uVar82;
LAB_015bdf71:
      do {
        do {
          root.ptr = puVar85[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_015bf081;
          puVar85 = puVar85 + -1;
          pauVar78 = pauVar78 + -1;
          local_2da0 = *pauVar78;
          auVar110 = ZEXT3264(local_2da0);
          auVar132 = vcmpps_avx(local_2da0,local_28c0,1);
        } while ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar132 >> 0x7f,0) == '\0') &&
                   (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar132 >> 0xbf,0) == '\0') &&
                 (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar132[0x1f]);
        uVar83 = vmovmskps_avx(auVar132);
        unaff_R12 = (RTCIntersectArguments *)CONCAT44((int)((ulong)unaff_R12 >> 0x20),uVar83);
        if (uVar82 < CONCAT44(0,POPCOUNT(uVar83))) {
LAB_015bdfae:
          do {
            lVar77 = -0x10;
            uVar84 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_015bf081;
              auVar132 = vcmpps_avx(local_28c0,auVar110._0_32_,6);
              if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar132 >> 0x7f,0) == '\0') &&
                    (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar132 >> 0xbf,0) == '\0') &&
                  (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar132[0x1f]) goto LAB_015bdf71;
              pRVar76 = (RTCIntersectArguments *)((ulong)(uVar84 & 0xf) - 8);
              local_2cf0 = pRVar76;
              auVar132 = vpcmpeqd_avx2(auVar132,auVar132);
              local_2c60 = auVar132 ^ local_2c80;
              unaff_R12 = (RTCIntersectArguments *)0x0;
              goto LAB_015be29c;
            }
            uVar75 = root.ptr & 0xfffffffffffffff0;
            auVar132 = vcmpps_avx(local_28c0,auVar110._0_32_,6);
            auVar110 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            root.ptr = 8;
            for (; (auVar105 = auVar110._0_32_, lVar77 != 0 &&
                   (uVar79 = *(ulong *)(uVar75 + 0x20 + lVar77 * 2), uVar79 != 8));
                lVar77 = lVar77 + 4) {
              uVar83 = *(undefined4 *)(uVar75 + 0x90 + lVar77);
              auVar122._4_4_ = uVar83;
              auVar122._0_4_ = uVar83;
              auVar122._8_4_ = uVar83;
              auVar122._12_4_ = uVar83;
              auVar122._16_4_ = uVar83;
              auVar122._20_4_ = uVar83;
              auVar122._24_4_ = uVar83;
              auVar122._28_4_ = uVar83;
              uVar83 = *(undefined4 *)(uVar75 + 0x30 + lVar77);
              auVar133._4_4_ = uVar83;
              auVar133._0_4_ = uVar83;
              auVar133._8_4_ = uVar83;
              auVar133._12_4_ = uVar83;
              auVar133._16_4_ = uVar83;
              auVar133._20_4_ = uVar83;
              auVar133._24_4_ = uVar83;
              auVar133._28_4_ = uVar83;
              auVar100 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar83 = *(undefined4 *)(uVar75 + 0xb0 + lVar77);
              auVar141._4_4_ = uVar83;
              auVar141._0_4_ = uVar83;
              auVar141._8_4_ = uVar83;
              auVar141._12_4_ = uVar83;
              auVar141._16_4_ = uVar83;
              auVar141._20_4_ = uVar83;
              auVar141._24_4_ = uVar83;
              auVar141._28_4_ = uVar83;
              auVar121 = vfmadd231ps_fma(auVar133,auVar100,auVar122);
              uVar83 = *(undefined4 *)(uVar75 + 0x50 + lVar77);
              auVar123._4_4_ = uVar83;
              auVar123._0_4_ = uVar83;
              auVar123._8_4_ = uVar83;
              auVar123._12_4_ = uVar83;
              auVar123._16_4_ = uVar83;
              auVar123._20_4_ = uVar83;
              auVar123._24_4_ = uVar83;
              auVar123._28_4_ = uVar83;
              auVar87 = vfmadd231ps_fma(auVar123,auVar100,auVar141);
              uVar83 = *(undefined4 *)(uVar75 + 0xd0 + lVar77);
              auVar142._4_4_ = uVar83;
              auVar142._0_4_ = uVar83;
              auVar142._8_4_ = uVar83;
              auVar142._12_4_ = uVar83;
              auVar142._16_4_ = uVar83;
              auVar142._20_4_ = uVar83;
              auVar142._24_4_ = uVar83;
              auVar142._28_4_ = uVar83;
              uVar83 = *(undefined4 *)(uVar75 + 0x70 + lVar77);
              auVar157._4_4_ = uVar83;
              auVar157._0_4_ = uVar83;
              auVar157._8_4_ = uVar83;
              auVar157._12_4_ = uVar83;
              auVar157._16_4_ = uVar83;
              auVar157._20_4_ = uVar83;
              auVar157._24_4_ = uVar83;
              auVar157._28_4_ = uVar83;
              uVar83 = *(undefined4 *)(uVar75 + 0xa0 + lVar77);
              auVar164._4_4_ = uVar83;
              auVar164._0_4_ = uVar83;
              auVar164._8_4_ = uVar83;
              auVar164._12_4_ = uVar83;
              auVar164._16_4_ = uVar83;
              auVar164._20_4_ = uVar83;
              auVar164._24_4_ = uVar83;
              auVar164._28_4_ = uVar83;
              uVar83 = *(undefined4 *)(uVar75 + 0x40 + lVar77);
              auVar177._4_4_ = uVar83;
              auVar177._0_4_ = uVar83;
              auVar177._8_4_ = uVar83;
              auVar177._12_4_ = uVar83;
              auVar177._16_4_ = uVar83;
              auVar177._20_4_ = uVar83;
              auVar177._24_4_ = uVar83;
              auVar177._28_4_ = uVar83;
              auVar13 = vfmadd231ps_fma(auVar157,auVar100,auVar142);
              auVar156 = vfmadd231ps_fma(auVar177,auVar100,auVar164);
              uVar83 = *(undefined4 *)(uVar75 + 0xc0 + lVar77);
              auVar143._4_4_ = uVar83;
              auVar143._0_4_ = uVar83;
              auVar143._8_4_ = uVar83;
              auVar143._12_4_ = uVar83;
              auVar143._16_4_ = uVar83;
              auVar143._20_4_ = uVar83;
              auVar143._24_4_ = uVar83;
              auVar143._28_4_ = uVar83;
              uVar83 = *(undefined4 *)(uVar75 + 0x60 + lVar77);
              auVar165._4_4_ = uVar83;
              auVar165._0_4_ = uVar83;
              auVar165._8_4_ = uVar83;
              auVar165._12_4_ = uVar83;
              auVar165._16_4_ = uVar83;
              auVar165._20_4_ = uVar83;
              auVar165._24_4_ = uVar83;
              auVar165._28_4_ = uVar83;
              uVar83 = *(undefined4 *)(uVar75 + 0xe0 + lVar77);
              auVar182._4_4_ = uVar83;
              auVar182._0_4_ = uVar83;
              auVar182._8_4_ = uVar83;
              auVar182._12_4_ = uVar83;
              auVar182._16_4_ = uVar83;
              auVar182._20_4_ = uVar83;
              auVar182._24_4_ = uVar83;
              auVar182._28_4_ = uVar83;
              auVar14 = vfmadd231ps_fma(auVar165,auVar100,auVar143);
              uVar83 = *(undefined4 *)(uVar75 + 0x80 + lVar77);
              auVar144._4_4_ = uVar83;
              auVar144._0_4_ = uVar83;
              auVar144._8_4_ = uVar83;
              auVar144._12_4_ = uVar83;
              auVar144._16_4_ = uVar83;
              auVar144._20_4_ = uVar83;
              auVar144._24_4_ = uVar83;
              auVar144._28_4_ = uVar83;
              auVar15 = vfmadd231ps_fma(auVar144,auVar100,auVar182);
              auVar46._8_8_ = local_2a60._8_8_;
              auVar46._0_8_ = local_2a60._0_8_;
              auVar46._16_8_ = local_2a60._16_8_;
              auVar46._24_8_ = local_2a60._24_8_;
              auVar47._8_8_ = local_2a60._40_8_;
              auVar47._0_8_ = local_2a60._32_8_;
              auVar47._16_8_ = local_2a60._48_8_;
              auVar47._24_8_ = local_2a60._56_8_;
              auVar48._8_8_ = local_2a60._72_8_;
              auVar48._0_8_ = local_2a60._64_8_;
              auVar48._16_8_ = local_2a60._80_8_;
              auVar48._24_8_ = local_2a60._88_8_;
              auVar190 = ZEXT3264(auVar48);
              auVar197 = ZEXT3264(local_29a0);
              auVar130 = vsubps_avx(ZEXT1632(auVar121),auVar46);
              auVar16._4_4_ = local_29a0._4_4_ * auVar130._4_4_;
              auVar16._0_4_ = local_29a0._0_4_ * auVar130._0_4_;
              auVar16._8_4_ = local_29a0._8_4_ * auVar130._8_4_;
              auVar16._12_4_ = local_29a0._12_4_ * auVar130._12_4_;
              auVar16._16_4_ = local_29a0._16_4_ * auVar130._16_4_;
              auVar16._20_4_ = local_29a0._20_4_ * auVar130._20_4_;
              auVar16._24_4_ = local_29a0._24_4_ * auVar130._24_4_;
              auVar16._28_4_ = auVar130._28_4_;
              auVar130 = vsubps_avx(ZEXT1632(auVar87),auVar47);
              in_ZMM12 = ZEXT3264(local_2980);
              auVar171._0_4_ = local_2980._0_4_ * auVar130._0_4_;
              auVar171._4_4_ = local_2980._4_4_ * auVar130._4_4_;
              auVar171._8_4_ = local_2980._8_4_ * auVar130._8_4_;
              auVar171._12_4_ = local_2980._12_4_ * auVar130._12_4_;
              auVar171._16_4_ = local_2980._16_4_ * auVar130._16_4_;
              auVar171._20_4_ = local_2980._20_4_ * auVar130._20_4_;
              auVar171._28_36_ = in_ZMM13._28_36_;
              auVar171._24_4_ = local_2980._24_4_ * auVar130._24_4_;
              auVar140 = auVar171._0_32_;
              in_ZMM13 = ZEXT3264(auVar140);
              auVar130 = vsubps_avx(ZEXT1632(auVar13),auVar48);
              auVar203._0_4_ = auVar130._0_4_ * (float)local_2960._0_4_;
              auVar203._4_4_ = auVar130._4_4_ * (float)local_2960._4_4_;
              auVar203._8_4_ = auVar130._8_4_ * fStack_2958;
              auVar203._12_4_ = auVar130._12_4_ * fStack_2954;
              auVar203._16_4_ = auVar130._16_4_ * fStack_2950;
              auVar203._20_4_ = auVar130._20_4_ * fStack_294c;
              auVar203._28_36_ = in_ZMM14._28_36_;
              auVar203._24_4_ = auVar130._24_4_ * fStack_2948;
              auVar163 = auVar203._0_32_;
              in_ZMM14 = ZEXT3264(auVar163);
              auVar130 = vsubps_avx(ZEXT1632(auVar156),auVar46);
              auVar178._0_4_ = local_29a0._0_4_ * auVar130._0_4_;
              auVar178._4_4_ = local_29a0._4_4_ * auVar130._4_4_;
              auVar178._8_4_ = local_29a0._8_4_ * auVar130._8_4_;
              auVar178._12_4_ = local_29a0._12_4_ * auVar130._12_4_;
              auVar178._16_4_ = local_29a0._16_4_ * auVar130._16_4_;
              auVar178._20_4_ = local_29a0._20_4_ * auVar130._20_4_;
              auVar178._24_4_ = local_29a0._24_4_ * auVar130._24_4_;
              auVar178._28_4_ = 0;
              auVar130 = vsubps_avx(ZEXT1632(auVar14),auVar47);
              auVar166._0_4_ = local_2980._0_4_ * auVar130._0_4_;
              auVar166._4_4_ = local_2980._4_4_ * auVar130._4_4_;
              auVar166._8_4_ = local_2980._8_4_ * auVar130._8_4_;
              auVar166._12_4_ = local_2980._12_4_ * auVar130._12_4_;
              auVar166._16_4_ = local_2980._16_4_ * auVar130._16_4_;
              auVar166._20_4_ = local_2980._20_4_ * auVar130._20_4_;
              auVar166._24_4_ = local_2980._24_4_ * auVar130._24_4_;
              auVar166._28_4_ = 0;
              auVar171 = ZEXT3264(auVar166);
              auVar130 = vsubps_avx(ZEXT1632(auVar15),auVar48);
              auVar145._0_4_ = auVar130._0_4_ * (float)local_2960._0_4_;
              auVar145._4_4_ = auVar130._4_4_ * (float)local_2960._4_4_;
              auVar145._8_4_ = auVar130._8_4_ * fStack_2958;
              auVar145._12_4_ = auVar130._12_4_ * fStack_2954;
              auVar145._16_4_ = auVar130._16_4_ * fStack_2950;
              auVar145._20_4_ = auVar130._20_4_ * fStack_294c;
              auVar145._24_4_ = auVar130._24_4_ * fStack_2948;
              auVar145._28_4_ = 0;
              auVar130 = vpminsd_avx2(auVar16,auVar178);
              auVar131 = vpminsd_avx2(auVar140,auVar166);
              auVar130 = vpmaxsd_avx2(auVar130,auVar131);
              auVar131 = vpminsd_avx2(auVar163,auVar145);
              auVar130 = vpmaxsd_avx2(auVar130,auVar131);
              auVar17._4_4_ = auVar130._4_4_ * 0.99999964;
              auVar17._0_4_ = auVar130._0_4_ * 0.99999964;
              auVar17._8_4_ = auVar130._8_4_ * 0.99999964;
              auVar17._12_4_ = auVar130._12_4_ * 0.99999964;
              auVar17._16_4_ = auVar130._16_4_ * 0.99999964;
              auVar17._20_4_ = auVar130._20_4_ * 0.99999964;
              auVar17._24_4_ = auVar130._24_4_ * 0.99999964;
              auVar17._28_4_ = auVar130._28_4_;
              auVar130 = vpmaxsd_avx2(auVar16,auVar178);
              auVar131 = vpmaxsd_avx2(auVar140,auVar166);
              auVar131 = vpminsd_avx2(auVar130,auVar131);
              auVar130 = vpmaxsd_avx2(auVar163,auVar145);
              auVar130 = vpminsd_avx2(auVar131,auVar130);
              auVar18._4_4_ = auVar130._4_4_ * 1.0000004;
              auVar18._0_4_ = auVar130._0_4_ * 1.0000004;
              auVar18._8_4_ = auVar130._8_4_ * 1.0000004;
              auVar18._12_4_ = auVar130._12_4_ * 1.0000004;
              auVar18._16_4_ = auVar130._16_4_ * 1.0000004;
              auVar18._20_4_ = auVar130._20_4_ * 1.0000004;
              auVar18._24_4_ = auVar130._24_4_ * 1.0000004;
              auVar18._28_4_ = auVar130._28_4_;
              auVar130 = vpmaxsd_avx2(auVar17,local_28e0);
              auVar131 = vpminsd_avx2(auVar18,local_28c0);
              auVar130 = vcmpps_avx(auVar130,auVar131,2);
              if ((uVar84 & 7) == 6) {
                uVar83 = *(undefined4 *)(uVar75 + 0xf0 + lVar77);
                auVar146._4_4_ = uVar83;
                auVar146._0_4_ = uVar83;
                auVar146._8_4_ = uVar83;
                auVar146._12_4_ = uVar83;
                auVar146._16_4_ = uVar83;
                auVar146._20_4_ = uVar83;
                auVar146._24_4_ = uVar83;
                auVar146._28_4_ = uVar83;
                auVar131 = vcmpps_avx(auVar146,auVar100,2);
                uVar83 = *(undefined4 *)(uVar75 + 0x100 + lVar77);
                auVar158._4_4_ = uVar83;
                auVar158._0_4_ = uVar83;
                auVar158._8_4_ = uVar83;
                auVar158._12_4_ = uVar83;
                auVar158._16_4_ = uVar83;
                auVar158._20_4_ = uVar83;
                auVar158._24_4_ = uVar83;
                auVar158._28_4_ = uVar83;
                auVar100 = vcmpps_avx(auVar100,auVar158,1);
                auVar100 = vandps_avx(auVar131,auVar100);
                auVar100 = vandps_avx(auVar100,auVar130);
                auVar121 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
              }
              else {
                auVar121 = vpackssdw_avx(auVar130._0_16_,auVar130._16_16_);
              }
              auVar87 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
              auVar121 = vpand_avx(auVar121,auVar87);
              auVar100 = vpmovzxwd_avx2(auVar121);
              auVar100 = vpslld_avx2(auVar100,0x1f);
              if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar100 >> 0x7f,0) == '\0') &&
                    (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar100 >> 0xbf,0) == '\0') &&
                  (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar100[0x1f]) {
                auVar110 = ZEXT3264(auVar105);
                uVar79 = root.ptr;
              }
              else {
                auVar134._8_4_ = 0x7f800000;
                auVar134._0_8_ = 0x7f8000007f800000;
                auVar134._12_4_ = 0x7f800000;
                auVar134._16_4_ = 0x7f800000;
                auVar134._20_4_ = 0x7f800000;
                auVar134._24_4_ = 0x7f800000;
                auVar134._28_4_ = 0x7f800000;
                auVar100 = vblendvps_avx(auVar134,auVar17,auVar100);
                auVar110 = ZEXT3264(auVar100);
                if (root.ptr != 8) {
                  *puVar85 = root.ptr;
                  puVar85 = puVar85 + 1;
                  *pauVar78 = auVar105;
                  pauVar78 = pauVar78 + 1;
                }
              }
              root.ptr = uVar79;
            }
            if (root.ptr == 8) goto LAB_015be230;
            auVar132 = vcmpps_avx(local_28c0,auVar105,6);
            uVar83 = vmovmskps_avx(auVar132);
          } while ((byte)uVar82 < (byte)POPCOUNT(uVar83));
          *puVar85 = root.ptr;
          puVar85 = puVar85 + 1;
          *pauVar78 = auVar105;
          pauVar78 = pauVar78 + 1;
LAB_015be230:
          iVar73 = 4;
        }
        else {
          local_2d40._0_8_ = CONCAT44(0,POPCOUNT(uVar83));
          while (unaff_R12 != (RTCIntersectArguments *)0x0) {
            k = 0;
            for (pRVar76 = unaff_R12; ((ulong)pRVar76 & 1) == 0;
                pRVar76 = (RTCIntersectArguments *)((ulong)pRVar76 >> 1 | 0x8000000000000000)) {
              k = k + 1;
            }
            unaff_R12 = (RTCIntersectArguments *)
                        ((ulong)((long)&unaff_R12[-1].intersect + 7) & (ulong)unaff_R12);
            local_2d20._0_8_ = k;
            auVar171 = ZEXT1664(auVar171._0_16_);
            auVar190 = ZEXT1664(auVar190._0_16_);
            auVar197 = ZEXT1664(auVar197._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            bVar72 = occluded1(local_2cf8,local_2d00,root,k,&local_2dc1,ray,
                               (TravRayK<8,_true> *)&local_2a60.field_0,context);
            uVar82 = local_2db8;
            if (bVar72) {
              *(undefined4 *)(local_2c80 + local_2d20._0_8_ * 4) = 0xffffffff;
            }
          }
          auVar132 = _DAT_01f7b020 & ~local_2c80;
          iVar73 = 3;
          if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar132 >> 0x7f,0) != '\0') ||
                (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar132 >> 0xbf,0) != '\0') ||
              (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar132[0x1f] < '\0') {
            auVar129._8_4_ = 0xff800000;
            auVar129._0_8_ = 0xff800000ff800000;
            auVar129._12_4_ = 0xff800000;
            auVar129._16_4_ = 0xff800000;
            auVar129._20_4_ = 0xff800000;
            auVar129._24_4_ = 0xff800000;
            auVar129._28_4_ = 0xff800000;
            local_28c0 = vblendvps_avx(local_28c0,auVar129,local_2c80);
            iVar73 = 2;
          }
          auVar110 = ZEXT3264(local_2da0);
          unaff_R12 = (RTCIntersectArguments *)0x0;
          if ((uint)uVar82 < (uint)local_2d40._0_4_) goto LAB_015bdfae;
        }
      } while ((iVar73 == 4) || (iVar73 == 2));
LAB_015bf081:
      auVar132 = vandps_avx(local_28a0,local_2c80);
      auVar109._8_4_ = 0xff800000;
      auVar109._0_8_ = 0xff800000ff800000;
      auVar109._12_4_ = 0xff800000;
      auVar109._16_4_ = 0xff800000;
      auVar109._20_4_ = 0xff800000;
      auVar109._24_4_ = 0xff800000;
      auVar109._28_4_ = 0xff800000;
      RVar4 = (RTCIntersectArguments)vmaskmovps_avx(auVar132,auVar109);
      *local_2d48 = RVar4;
    }
  }
  return;
LAB_015be29c:
  do {
    auVar132 = auVar110._0_32_;
    if (unaff_R12 == local_2cf0) break;
    local_2da0._0_8_ = (long)unaff_R12 * 0x50 + (root.ptr & 0xfffffffffffffff0);
    uVar74 = vmovmskps_avx(local_2c60);
    local_2da8 = CONCAT44((int)((ulong)pRVar76 >> 0x20),uVar74);
    uVar84 = 0;
    for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
      uVar84 = uVar84 + 1;
    }
    local_2ce8 = (ulong)uVar84;
    pRVar76 = (RTCIntersectArguments *)0x0;
    for (uVar75 = local_2da8; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
      pRVar76 = (RTCIntersectArguments *)((long)&pRVar76->flags + 1);
    }
    lVar77 = 0;
    local_2dc0 = unaff_R12;
    local_2db0 = pRVar76;
    auVar105 = local_2c60;
    do {
      if ((lVar77 == 4) || (*(int *)(local_2da0._0_8_ + 0x40 + lVar77 * 4) == -1)) break;
      pRVar76 = (RTCIntersectArguments *)(context->scene->geometries).items;
      pGVar7 = *(Geometry **)
                ((long)&pRVar76->flags + (ulong)*(uint *)(local_2da0._0_8_ + 0x30 + lVar77 * 4) * 8)
      ;
      BVar3 = pGVar7->time_range;
      auVar87._8_8_ = 0;
      auVar87._0_4_ = BVar3.lower;
      auVar87._4_4_ = BVar3.upper;
      fVar86 = BVar3.lower;
      auVar101._4_4_ = fVar86;
      auVar101._0_4_ = fVar86;
      auVar101._8_4_ = fVar86;
      auVar101._12_4_ = fVar86;
      auVar101._16_4_ = fVar86;
      auVar101._20_4_ = fVar86;
      auVar101._24_4_ = fVar86;
      auVar101._28_4_ = fVar86;
      auVar132 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar101);
      auVar121 = vmovshdup_avx(auVar87);
      auVar121 = vsubps_avx(auVar121,auVar87);
      auVar88._0_4_ = auVar121._0_4_;
      auVar88._4_4_ = auVar88._0_4_;
      auVar88._8_4_ = auVar88._0_4_;
      auVar88._12_4_ = auVar88._0_4_;
      auVar88._16_4_ = auVar88._0_4_;
      auVar88._20_4_ = auVar88._0_4_;
      auVar88._24_4_ = auVar88._0_4_;
      auVar88._28_4_ = auVar88._0_4_;
      auVar132 = vdivps_avx(auVar132,auVar88);
      fVar86 = pGVar7->fnumTimeSegments;
      auVar200._4_4_ = fVar86 * auVar132._4_4_;
      auVar200._0_4_ = fVar86 * auVar132._0_4_;
      auVar200._8_4_ = fVar86 * auVar132._8_4_;
      auVar200._12_4_ = fVar86 * auVar132._12_4_;
      auVar200._16_4_ = fVar86 * auVar132._16_4_;
      auVar200._20_4_ = fVar86 * auVar132._20_4_;
      auVar200._24_4_ = fVar86 * auVar132._24_4_;
      auVar200._28_4_ = auVar132._28_4_;
      auVar132 = vroundps_avx(auVar200,1);
      fVar86 = fVar86 + -1.0;
      auVar102._4_4_ = fVar86;
      auVar102._0_4_ = fVar86;
      auVar102._8_4_ = fVar86;
      auVar102._12_4_ = fVar86;
      auVar102._16_4_ = fVar86;
      auVar102._20_4_ = fVar86;
      auVar102._24_4_ = fVar86;
      auVar102._28_4_ = fVar86;
      auVar132 = vminps_avx(auVar132,auVar102);
      auVar132 = vmaxps_avx(auVar132,_DAT_01f7b000);
      auVar100 = vsubps_avx(auVar200,auVar132);
      auVar132 = vcvtps2dq_avx(auVar132);
      local_2d80.valid = (int *)auVar132._0_8_;
      local_2d80.geometryUserPtr = (void *)auVar132._8_8_;
      local_2d80.context = (RTCRayQueryContext *)auVar132._16_8_;
      local_2d80.ray = (RTCRayN *)auVar132._24_8_;
      iVar73 = *(int *)((long)&local_2d80.valid + local_2ce8 * 4);
      auVar124._4_4_ = iVar73;
      auVar124._0_4_ = iVar73;
      auVar124._8_4_ = iVar73;
      auVar124._12_4_ = iVar73;
      auVar124._16_4_ = iVar73;
      auVar124._20_4_ = iVar73;
      auVar124._24_4_ = iVar73;
      auVar124._28_4_ = iVar73;
      auVar132 = vpcmpeqd_avx2(auVar124,auVar132);
      auVar132 = local_2c60 & ~auVar132;
      local_2d20 = auVar105;
      fVar93 = auVar100._4_4_;
      fVar94 = auVar100._8_4_;
      fVar95 = auVar100._12_4_;
      fVar96 = auVar100._16_4_;
      fVar97 = auVar100._20_4_;
      fVar98 = auVar100._24_4_;
      fVar86 = auVar100._0_4_;
      auVar110._28_36_ = in_ZMM14._28_36_;
      uVar75 = local_2da8;
      pRVar80 = local_2db0;
      if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar132 >> 0x7f,0) == '\0') &&
            (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar132 >> 0xbf,0) == '\0') &&
          (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar132[0x1f]) {
        lVar81 = *(long *)(*(long *)&pGVar7[2].numPrimitives + (long)iVar73 * 0x38);
        lVar8 = *(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + (long)iVar73 * 0x38);
        uVar75 = (ulong)*(uint *)(local_2da0._0_8_ + lVar77 * 4);
        uVar79 = (ulong)*(uint *)(local_2da0._0_8_ + 0x10 + lVar77 * 4);
        uVar83 = *(undefined4 *)(lVar81 + uVar75 * 4);
        auVar135._4_4_ = uVar83;
        auVar135._0_4_ = uVar83;
        auVar135._8_4_ = uVar83;
        auVar135._12_4_ = uVar83;
        auVar135._16_4_ = uVar83;
        auVar135._20_4_ = uVar83;
        auVar135._24_4_ = uVar83;
        auVar135._28_4_ = uVar83;
        uVar83 = *(undefined4 *)(lVar81 + 4 + uVar75 * 4);
        auVar147._4_4_ = uVar83;
        auVar147._0_4_ = uVar83;
        auVar147._8_4_ = uVar83;
        auVar147._12_4_ = uVar83;
        auVar147._16_4_ = uVar83;
        auVar147._20_4_ = uVar83;
        auVar147._24_4_ = uVar83;
        auVar147._28_4_ = uVar83;
        uVar2 = *(undefined4 *)(lVar81 + 8 + uVar75 * 4);
        auVar167._4_4_ = uVar2;
        auVar167._0_4_ = uVar2;
        auVar167._8_4_ = uVar2;
        auVar167._12_4_ = uVar2;
        auVar167._16_4_ = uVar2;
        auVar167._20_4_ = uVar2;
        auVar167._24_4_ = uVar2;
        auVar167._28_4_ = uVar2;
        fVar99 = *(float *)(lVar8 + uVar75 * 4);
        fVar113 = *(float *)(lVar8 + 4 + uVar75 * 4);
        fVar115 = *(float *)(lVar8 + 8 + uVar75 * 4);
        auVar125._8_4_ = 0x3f800000;
        auVar125._0_8_ = 0x3f8000003f800000;
        auVar125._12_4_ = 0x3f800000;
        auVar125._16_4_ = 0x3f800000;
        auVar125._20_4_ = 0x3f800000;
        auVar125._24_4_ = 0x3f800000;
        auVar125._28_4_ = 0x3f800000;
        auVar132 = vsubps_avx(auVar125,auVar100);
        auVar19._4_4_ = fVar93 * fVar99;
        auVar19._0_4_ = fVar86 * fVar99;
        auVar19._8_4_ = fVar94 * fVar99;
        auVar19._12_4_ = fVar95 * fVar99;
        auVar19._16_4_ = fVar96 * fVar99;
        auVar19._20_4_ = fVar97 * fVar99;
        auVar19._24_4_ = fVar98 * fVar99;
        auVar19._28_4_ = 0x3f800000;
        auVar20._4_4_ = fVar93 * fVar113;
        auVar20._0_4_ = fVar86 * fVar113;
        auVar20._8_4_ = fVar94 * fVar113;
        auVar20._12_4_ = fVar95 * fVar113;
        auVar20._16_4_ = fVar96 * fVar113;
        auVar20._20_4_ = fVar97 * fVar113;
        auVar20._24_4_ = fVar98 * fVar113;
        auVar20._28_4_ = fVar99;
        auVar21._4_4_ = fVar93 * fVar115;
        auVar21._0_4_ = fVar86 * fVar115;
        auVar21._8_4_ = fVar94 * fVar115;
        auVar21._12_4_ = fVar95 * fVar115;
        auVar21._16_4_ = fVar96 * fVar115;
        auVar21._20_4_ = fVar97 * fVar115;
        auVar21._24_4_ = fVar98 * fVar115;
        auVar21._28_4_ = fVar113;
        auVar121 = vfmadd231ps_fma(auVar19,auVar132,auVar135);
        auVar127 = ZEXT1632(auVar121);
        auVar121 = vfmadd231ps_fma(auVar20,auVar132,auVar147);
        auVar107 = ZEXT1632(auVar121);
        uVar2 = *(undefined4 *)(lVar81 + uVar79 * 4);
        auVar179._4_4_ = uVar2;
        auVar179._0_4_ = uVar2;
        auVar179._8_4_ = uVar2;
        auVar179._12_4_ = uVar2;
        auVar179._16_4_ = uVar2;
        auVar179._20_4_ = uVar2;
        auVar179._24_4_ = uVar2;
        auVar179._28_4_ = uVar2;
        uVar2 = *(undefined4 *)(lVar81 + 4 + uVar79 * 4);
        auVar183._4_4_ = uVar2;
        auVar183._0_4_ = uVar2;
        auVar183._8_4_ = uVar2;
        auVar183._12_4_ = uVar2;
        auVar183._16_4_ = uVar2;
        auVar183._20_4_ = uVar2;
        auVar183._24_4_ = uVar2;
        auVar183._28_4_ = uVar2;
        uVar2 = *(undefined4 *)(lVar81 + 8 + uVar79 * 4);
        auVar189._4_4_ = uVar2;
        auVar189._0_4_ = uVar2;
        auVar189._8_4_ = uVar2;
        auVar189._12_4_ = uVar2;
        auVar189._16_4_ = uVar2;
        auVar189._20_4_ = uVar2;
        auVar189._24_4_ = uVar2;
        auVar189._28_4_ = uVar2;
        fVar99 = *(float *)(lVar8 + uVar79 * 4);
        fVar113 = *(float *)(lVar8 + 4 + uVar79 * 4);
        auVar121 = vfmadd231ps_fma(auVar21,auVar132,auVar167);
        auVar161 = ZEXT1632(auVar121);
        fVar115 = *(float *)(lVar8 + 8 + uVar79 * 4);
        auVar22._4_4_ = fVar93 * fVar99;
        auVar22._0_4_ = fVar86 * fVar99;
        auVar22._8_4_ = fVar94 * fVar99;
        auVar22._12_4_ = fVar95 * fVar99;
        auVar22._16_4_ = fVar96 * fVar99;
        auVar22._20_4_ = fVar97 * fVar99;
        auVar22._24_4_ = fVar98 * fVar99;
        auVar22._28_4_ = uVar83;
        auVar23._4_4_ = fVar113 * fVar93;
        auVar23._0_4_ = fVar113 * fVar86;
        auVar23._8_4_ = fVar113 * fVar94;
        auVar23._12_4_ = fVar113 * fVar95;
        auVar23._16_4_ = fVar113 * fVar96;
        auVar23._20_4_ = fVar113 * fVar97;
        auVar23._24_4_ = fVar113 * fVar98;
        auVar23._28_4_ = fVar99;
        auVar24._4_4_ = fVar93 * fVar115;
        auVar24._0_4_ = fVar86 * fVar115;
        auVar24._8_4_ = fVar94 * fVar115;
        auVar24._12_4_ = fVar95 * fVar115;
        auVar24._16_4_ = fVar96 * fVar115;
        auVar24._20_4_ = fVar97 * fVar115;
        auVar24._24_4_ = fVar98 * fVar115;
        auVar24._28_4_ = fVar115;
        auVar121 = vfmadd231ps_fma(auVar22,auVar132,auVar179);
        auVar149 = ZEXT1632(auVar121);
        auVar121 = vfmadd231ps_fma(auVar23,auVar132,auVar183);
        auVar138 = ZEXT1632(auVar121);
        auVar121 = vfmadd231ps_fma(auVar24,auVar132,auVar189);
        auVar170 = ZEXT1632(auVar121);
        uVar75 = (ulong)*(uint *)(local_2da0._0_8_ + 0x20 + lVar77 * 4);
        uVar83 = *(undefined4 *)(lVar81 + uVar75 * 4);
        auVar196._4_4_ = uVar83;
        auVar196._0_4_ = uVar83;
        auVar196._8_4_ = uVar83;
        auVar196._12_4_ = uVar83;
        auVar196._16_4_ = uVar83;
        auVar196._20_4_ = uVar83;
        auVar196._24_4_ = uVar83;
        auVar196._28_4_ = uVar83;
        uVar83 = *(undefined4 *)(lVar81 + 4 + uVar75 * 4);
        auVar198._4_4_ = uVar83;
        auVar198._0_4_ = uVar83;
        auVar198._8_4_ = uVar83;
        auVar198._12_4_ = uVar83;
        auVar198._16_4_ = uVar83;
        auVar198._20_4_ = uVar83;
        auVar198._24_4_ = uVar83;
        auVar198._28_4_ = uVar83;
        uVar83 = *(undefined4 *)(lVar81 + 8 + uVar75 * 4);
        auVar199._4_4_ = uVar83;
        auVar199._0_4_ = uVar83;
        auVar199._8_4_ = uVar83;
        auVar199._12_4_ = uVar83;
        auVar199._16_4_ = uVar83;
        auVar199._20_4_ = uVar83;
        auVar199._24_4_ = uVar83;
        auVar199._28_4_ = uVar83;
        fVar99 = *(float *)(lVar8 + uVar75 * 4);
        fVar113 = *(float *)(lVar8 + 4 + uVar75 * 4);
        fVar115 = *(float *)(lVar8 + 8 + uVar75 * 4);
        auVar110._0_4_ = fVar86 * fVar99;
        auVar110._4_4_ = fVar93 * fVar99;
        auVar110._8_4_ = fVar94 * fVar99;
        auVar110._12_4_ = fVar95 * fVar99;
        auVar110._16_4_ = fVar96 * fVar99;
        auVar110._20_4_ = fVar97 * fVar99;
        auVar110._24_4_ = fVar98 * fVar99;
        auVar25._4_4_ = fVar113 * fVar93;
        auVar25._0_4_ = fVar113 * fVar86;
        auVar25._8_4_ = fVar113 * fVar94;
        auVar25._12_4_ = fVar113 * fVar95;
        auVar25._16_4_ = fVar113 * fVar96;
        auVar25._20_4_ = fVar113 * fVar97;
        auVar25._24_4_ = fVar113 * fVar98;
        auVar25._28_4_ = fVar113;
        auVar26._4_4_ = fVar115 * fVar93;
        auVar26._0_4_ = fVar115 * fVar86;
        auVar26._8_4_ = fVar115 * fVar94;
        auVar26._12_4_ = fVar115 * fVar95;
        auVar26._16_4_ = fVar115 * fVar96;
        auVar26._20_4_ = fVar115 * fVar97;
        auVar26._24_4_ = fVar115 * fVar98;
        auVar26._28_4_ = fVar115;
        auVar121 = vfmadd231ps_fma(auVar110._0_32_,auVar132,auVar196);
        auVar202 = ZEXT1632(auVar121);
        auVar121 = vfmadd231ps_fma(auVar25,auVar132,auVar198);
        auVar186 = ZEXT1632(auVar121);
        auVar121 = vfmadd231ps_fma(auVar26,auVar132,auVar199);
        auVar171 = ZEXT1664(auVar121);
      }
      else {
        while (fVar11 = fStack_2cc4, fVar193 = fStack_2cc8, fVar192 = fStack_2ccc,
              fVar191 = fStack_2cd0, fVar117 = local_2ce0[3], fVar115 = local_2ce0[2],
              fVar113 = local_2ce0[1], fVar99 = local_2ce0[0], uVar75 != 0) {
          lVar81 = (long)*(int *)((long)&local_2d80.valid + (long)pRVar80 * 4) * 0x38;
          uVar79 = (ulong)*(uint *)(local_2da0._0_8_ + lVar77 * 4);
          auVar121 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar7[2].numPrimitives + lVar81) + uVar79 * 4);
          pfVar1 = (float *)(*(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar81) +
                            uVar79 * 4);
          fVar99 = *pfVar1;
          fVar113 = pfVar1[1];
          fVar115 = pfVar1[2];
          *(int *)((long)&local_2bc0 + (long)pRVar80 * 4) = auVar121._0_4_;
          uVar83 = vextractps_avx(auVar121,1);
          *(undefined4 *)((long)&local_2bc0 + (long)pRVar80 * 4 + 0x20) = uVar83;
          uVar83 = vextractps_avx(auVar121,2);
          *(undefined4 *)((long)&local_2bc0 + (long)pRVar80 * 4 + 0x40) = uVar83;
          local_2ce0[(long)pRVar80] = fVar99;
          local_2cc0[(long)pRVar80] = fVar113;
          local_2ca0[(long)pRVar80] = fVar115;
          uVar79 = (ulong)pRVar80 & 0x3f;
          pRVar80 = (RTCIntersectArguments *)0x0;
          uVar75 = uVar75 ^ 1L << uVar79;
          for (uVar79 = uVar75; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
            pRVar80 = (RTCIntersectArguments *)((long)&pRVar80->flags + 1);
          }
        }
        auVar106._8_4_ = 0x3f800000;
        auVar106._0_8_ = 0x3f8000003f800000;
        auVar106._12_4_ = 0x3f800000;
        auVar106._16_4_ = 0x3f800000;
        auVar106._20_4_ = 0x3f800000;
        auVar106._24_4_ = 0x3f800000;
        auVar106._28_4_ = 0x3f800000;
        auVar132 = vsubps_avx(auVar106,auVar100);
        uVar83 = local_2bc0._0_4_;
        uVar2 = local_2bc0._4_4_;
        uVar51 = local_2bc0._8_4_;
        uVar52 = local_2bc0._12_4_;
        uVar53 = local_2bc0._16_4_;
        uVar54 = local_2bc0._20_4_;
        uVar55 = local_2bc0._24_4_;
        uVar56 = local_2bc0._28_4_;
        uVar57 = local_2bc0._64_4_;
        uVar58 = local_2bc0._68_4_;
        uVar60 = local_2bc0._72_4_;
        uVar62 = local_2bc0._76_4_;
        uVar64 = local_2bc0._80_4_;
        uVar66 = local_2bc0._84_4_;
        uVar68 = local_2bc0._88_4_;
        uVar70 = local_2bc0._92_4_;
        fVar139 = auVar132._0_4_;
        fVar150 = auVar132._4_4_;
        fVar151 = auVar132._8_4_;
        fVar152 = auVar132._12_4_;
        fVar153 = auVar132._16_4_;
        fVar154 = auVar132._20_4_;
        fVar155 = auVar132._24_4_;
        auVar107._0_4_ = fVar139 * (float)local_2bc0._32_4_ + fVar86 * local_2cc0[0];
        auVar107._4_4_ = fVar150 * (float)local_2bc0._36_4_ + fVar93 * local_2cc0[1];
        auVar107._8_4_ = fVar151 * (float)local_2bc0._40_4_ + fVar94 * local_2cc0[2];
        auVar107._12_4_ = fVar152 * (float)local_2bc0._44_4_ + fVar95 * local_2cc0[3];
        auVar107._16_4_ = fVar153 * (float)local_2bc0._48_4_ + fVar96 * fStack_2cb0;
        auVar107._20_4_ = fVar154 * (float)local_2bc0._52_4_ + fVar97 * fStack_2cac;
        auVar107._24_4_ = fVar155 * (float)local_2bc0._56_4_ + fVar98 * fStack_2ca8;
        fVar12 = auVar171._28_4_;
        auVar107._28_4_ = fVar12 + 1.0;
        fVar162 = fVar86 * local_2ca0[0];
        fVar172 = fVar93 * local_2ca0[1];
        fVar173 = fVar94 * local_2ca0[2];
        fVar174 = fVar95 * local_2ca0[3];
        fVar175 = fVar96 * fStack_2c90;
        fVar176 = fVar97 * fStack_2c8c;
        fVar112 = fVar98 * fStack_2c88;
        uVar75 = local_2da8;
        pRVar80 = local_2db0;
        while (fVar205 = fStack_2cc4, fVar204 = fStack_2cc8, fVar201 = fStack_2ccc,
              fVar120 = fStack_2cd0, fVar119 = local_2ce0[3], fVar118 = local_2ce0[2],
              fVar116 = local_2ce0[1], fVar114 = local_2ce0[0], uVar75 != 0) {
          lVar81 = (long)*(int *)((long)&local_2d80.valid + (long)pRVar80 * 4) * 0x38;
          uVar79 = (ulong)*(uint *)(local_2da0._0_8_ + 0x10 + lVar77 * 4);
          auVar121 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar7[2].numPrimitives + lVar81) + uVar79 * 4);
          auVar87 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar81) + uVar79 * 4);
          *(int *)((long)&local_2bc0 + (long)pRVar80 * 4) = auVar121._0_4_;
          uVar5 = vextractps_avx(auVar121,1);
          *(undefined4 *)((long)&local_2bc0 + (long)pRVar80 * 4 + 0x20) = uVar5;
          uVar5 = vextractps_avx(auVar121,2);
          *(undefined4 *)((long)&local_2bc0 + (long)pRVar80 * 4 + 0x40) = uVar5;
          local_2ce0[(long)pRVar80] = auVar87._0_4_;
          fVar114 = (float)vextractps_avx(auVar87,1);
          local_2cc0[(long)pRVar80] = fVar114;
          fVar114 = (float)vextractps_avx(auVar87,2);
          local_2ca0[(long)pRVar80] = fVar114;
          uVar79 = (ulong)pRVar80 & 0x3f;
          pRVar80 = (RTCIntersectArguments *)0x0;
          uVar75 = uVar75 ^ 1L << uVar79;
          for (uVar79 = uVar75; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
            pRVar80 = (RTCIntersectArguments *)((long)&pRVar80->flags + 1);
          }
        }
        auVar127._0_4_ = fVar139 * (float)uVar83 + fVar86 * fVar99;
        auVar127._4_4_ = fVar150 * (float)uVar2 + fVar93 * fVar113;
        auVar127._8_4_ = fVar151 * (float)uVar51 + fVar94 * fVar115;
        auVar127._12_4_ = fVar152 * (float)uVar52 + fVar95 * fVar117;
        auVar127._16_4_ = fVar153 * (float)uVar53 + fVar96 * fVar191;
        auVar127._20_4_ = fVar154 * (float)uVar54 + fVar97 * fVar192;
        auVar127._24_4_ = fVar155 * (float)uVar55 + fVar98 * fVar193;
        auVar127._28_4_ = (float)uVar56 + fVar11;
        uVar83 = local_2bc0._0_4_;
        uVar2 = local_2bc0._4_4_;
        uVar51 = local_2bc0._8_4_;
        uVar52 = local_2bc0._12_4_;
        uVar53 = local_2bc0._16_4_;
        uVar54 = local_2bc0._20_4_;
        uVar55 = local_2bc0._24_4_;
        uVar56 = local_2bc0._28_4_;
        uVar5 = local_2bc0._64_4_;
        uVar59 = local_2bc0._68_4_;
        uVar61 = local_2bc0._72_4_;
        uVar63 = local_2bc0._76_4_;
        uVar65 = local_2bc0._80_4_;
        uVar67 = local_2bc0._84_4_;
        uVar69 = local_2bc0._88_4_;
        uVar71 = local_2bc0._92_4_;
        auVar138._0_4_ = fVar86 * local_2cc0[0] + fVar139 * (float)local_2bc0._32_4_;
        auVar138._4_4_ = fVar93 * local_2cc0[1] + fVar150 * (float)local_2bc0._36_4_;
        auVar138._8_4_ = fVar94 * local_2cc0[2] + fVar151 * (float)local_2bc0._40_4_;
        auVar138._12_4_ = fVar95 * local_2cc0[3] + fVar152 * (float)local_2bc0._44_4_;
        auVar138._16_4_ = fVar96 * fStack_2cb0 + fVar153 * (float)local_2bc0._48_4_;
        auVar138._20_4_ = fVar97 * fStack_2cac + fVar154 * (float)local_2bc0._52_4_;
        auVar138._24_4_ = fVar98 * fStack_2ca8 + fVar155 * (float)local_2bc0._56_4_;
        fVar194 = auVar190._28_4_;
        auVar138._28_4_ = fVar194 + fVar11;
        fVar99 = fVar86 * local_2ca0[0];
        fVar113 = fVar93 * local_2ca0[1];
        fVar115 = fVar94 * local_2ca0[2];
        fVar117 = fVar95 * local_2ca0[3];
        fVar191 = fVar96 * fStack_2c90;
        fVar192 = fVar97 * fStack_2c8c;
        fVar193 = fVar98 * fStack_2c88;
        uVar75 = local_2da8;
        pRVar80 = local_2db0;
        while (uVar75 != 0) {
          lVar81 = (long)*(int *)((long)&local_2d80.valid + (long)pRVar80 * 4) * 0x38;
          uVar79 = (ulong)*(uint *)(local_2da0._0_8_ + 0x20 + lVar77 * 4);
          auVar121 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar7[2].numPrimitives + lVar81) + uVar79 * 4);
          auVar197 = ZEXT1664(auVar121);
          auVar87 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar81) + uVar79 * 4);
          in_ZMM12 = ZEXT1664(auVar87);
          *(int *)((long)&local_2bc0 + (long)pRVar80 * 4) = auVar121._0_4_;
          uVar6 = vextractps_avx(auVar121,1);
          *(undefined4 *)((long)&local_2bc0 + (long)pRVar80 * 4 + 0x20) = uVar6;
          uVar6 = vextractps_avx(auVar121,2);
          *(undefined4 *)((long)&local_2bc0 + (long)pRVar80 * 4 + 0x40) = uVar6;
          local_2ce0[(long)pRVar80] = auVar87._0_4_;
          fVar11 = (float)vextractps_avx(auVar87,1);
          local_2cc0[(long)pRVar80] = fVar11;
          fVar11 = (float)vextractps_avx(auVar87,2);
          local_2ca0[(long)pRVar80] = fVar11;
          uVar79 = (ulong)pRVar80 & 0x3f;
          pRVar80 = (RTCIntersectArguments *)0x0;
          uVar75 = uVar75 ^ 1L << uVar79;
          for (uVar79 = uVar75; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
            pRVar80 = (RTCIntersectArguments *)((long)&pRVar80->flags + 1);
          }
        }
        auVar161._0_4_ = fVar139 * (float)uVar57 + fVar162;
        auVar161._4_4_ = fVar150 * (float)uVar58 + fVar172;
        auVar161._8_4_ = fVar151 * (float)uVar60 + fVar173;
        auVar161._12_4_ = fVar152 * (float)uVar62 + fVar174;
        auVar161._16_4_ = fVar153 * (float)uVar64 + fVar175;
        auVar161._20_4_ = fVar154 * (float)uVar66 + fVar176;
        auVar161._24_4_ = fVar155 * (float)uVar68 + fVar112;
        auVar161._28_4_ = (float)uVar70 + fVar12;
        auVar170._0_4_ = fVar99 + (float)uVar5 * fVar139;
        auVar170._4_4_ = fVar113 + (float)uVar59 * fVar150;
        auVar170._8_4_ = fVar115 + (float)uVar61 * fVar151;
        auVar170._12_4_ = fVar117 + (float)uVar63 * fVar152;
        auVar170._16_4_ = fVar191 + (float)uVar65 * fVar153;
        auVar170._20_4_ = fVar192 + (float)uVar67 * fVar154;
        auVar170._24_4_ = fVar193 + (float)uVar69 * fVar155;
        auVar170._28_4_ = fVar194 + fVar12;
        auVar149._0_4_ = fVar114 * fVar86 + fVar139 * (float)uVar83;
        auVar149._4_4_ = fVar116 * fVar93 + fVar150 * (float)uVar2;
        auVar149._8_4_ = fVar118 * fVar94 + fVar151 * (float)uVar51;
        auVar149._12_4_ = fVar119 * fVar95 + fVar152 * (float)uVar52;
        auVar149._16_4_ = fVar120 * fVar96 + fVar153 * (float)uVar53;
        auVar149._20_4_ = fVar201 * fVar97 + fVar154 * (float)uVar54;
        auVar149._24_4_ = fVar204 * fVar98 + fVar155 * (float)uVar55;
        auVar149._28_4_ = (float)uVar71 + (float)uVar56;
        auVar202._0_4_ = fVar139 * (float)local_2bc0._0_4_ + fVar86 * local_2ce0[0];
        auVar202._4_4_ = fVar150 * (float)local_2bc0._4_4_ + fVar93 * local_2ce0[1];
        auVar202._8_4_ = fVar151 * (float)local_2bc0._8_4_ + fVar94 * local_2ce0[2];
        auVar202._12_4_ = fVar152 * (float)local_2bc0._12_4_ + fVar95 * local_2ce0[3];
        auVar202._16_4_ = fVar153 * (float)local_2bc0._16_4_ + fVar96 * fStack_2cd0;
        auVar202._20_4_ = fVar154 * (float)local_2bc0._20_4_ + fVar97 * fStack_2ccc;
        auVar202._24_4_ = fVar155 * (float)local_2bc0._24_4_ + fVar98 * fStack_2cc8;
        auVar202._28_4_ = fVar205 + in_ZMM12._28_4_;
        auVar186._0_4_ = fVar139 * (float)local_2bc0._32_4_ + fVar86 * local_2cc0[0];
        auVar186._4_4_ = fVar150 * (float)local_2bc0._36_4_ + fVar93 * local_2cc0[1];
        auVar186._8_4_ = fVar151 * (float)local_2bc0._40_4_ + fVar94 * local_2cc0[2];
        auVar186._12_4_ = fVar152 * (float)local_2bc0._44_4_ + fVar95 * local_2cc0[3];
        auVar186._16_4_ = fVar153 * (float)local_2bc0._48_4_ + fVar96 * fStack_2cb0;
        auVar186._20_4_ = fVar154 * (float)local_2bc0._52_4_ + fVar97 * fStack_2cac;
        auVar186._24_4_ = fVar155 * (float)local_2bc0._56_4_ + fVar98 * fStack_2ca8;
        auVar186._28_4_ = fVar194 + (float)uVar71;
        auVar171 = ZEXT3264(CONCAT428(auVar197._28_4_ + auVar100._28_4_,
                                      CONCAT424(fVar155 * (float)local_2bc0._88_4_ +
                                                fVar98 * fStack_2c88,
                                                CONCAT420(fVar154 * (float)local_2bc0._84_4_ +
                                                          fVar97 * fStack_2c8c,
                                                          CONCAT416(fVar153 * (float)local_2bc0.
                                                                                     _80_4_ +
                                                                    fVar96 * fStack_2c90,
                                                                    CONCAT412(fVar152 * (float)
                                                  local_2bc0._76_4_ + fVar95 * local_2ca0[3],
                                                  CONCAT48(fVar151 * (float)local_2bc0._72_4_ +
                                                           fVar94 * local_2ca0[2],
                                                           CONCAT44(fVar150 * (float)local_2bc0.
                                                                                     _68_4_ +
                                                                    fVar93 * local_2ca0[1],
                                                                    fVar139 * (float)local_2bc0.
                                                                                     _64_4_ +
                                                                    fVar86 * local_2ca0[0]))))))));
      }
      local_2a70 = *(undefined8 *)(local_2da0._0_8_ + 0x30);
      uStack_2a68 = *(undefined8 *)(local_2da0._0_8_ + 0x38);
      local_2a80 = *(undefined8 *)(local_2da0._0_8_ + 0x40);
      uStack_2a78 = *(undefined8 *)(local_2da0._0_8_ + 0x48);
      auVar132 = *(undefined1 (*) [32])ray;
      auVar100 = *(undefined1 (*) [32])(ray + 0x20);
      auVar130 = *(undefined1 (*) [32])(ray + 0x40);
      local_2c20 = vsubps_avx(auVar127,auVar132);
      local_2be0 = vsubps_avx(auVar107,auVar100);
      local_2c40 = vsubps_avx(auVar161,auVar130);
      auVar131 = vsubps_avx(auVar149,auVar132);
      auVar140 = vsubps_avx(auVar138,auVar100);
      auVar163 = vsubps_avx(auVar170,auVar130);
      auVar104 = vsubps_avx(auVar202,auVar132);
      auVar187 = vsubps_avx(auVar186,auVar100);
      auVar130 = vsubps_avx(auVar171._0_32_,auVar130);
      local_26a0 = vsubps_avx(auVar104,local_2c20);
      local_2c00 = vsubps_avx(auVar187,local_2be0);
      local_26c0 = vsubps_avx(auVar130,local_2c40);
      auVar136._0_4_ = auVar104._0_4_ + local_2c20._0_4_;
      auVar136._4_4_ = auVar104._4_4_ + local_2c20._4_4_;
      auVar136._8_4_ = auVar104._8_4_ + local_2c20._8_4_;
      auVar136._12_4_ = auVar104._12_4_ + local_2c20._12_4_;
      auVar136._16_4_ = auVar104._16_4_ + local_2c20._16_4_;
      auVar136._20_4_ = auVar104._20_4_ + local_2c20._20_4_;
      auVar136._24_4_ = auVar104._24_4_ + local_2c20._24_4_;
      auVar136._28_4_ = auVar104._28_4_ + local_2c20._28_4_;
      auVar168._0_4_ = local_2be0._0_4_ + auVar187._0_4_;
      auVar168._4_4_ = local_2be0._4_4_ + auVar187._4_4_;
      auVar168._8_4_ = local_2be0._8_4_ + auVar187._8_4_;
      auVar168._12_4_ = local_2be0._12_4_ + auVar187._12_4_;
      auVar168._16_4_ = local_2be0._16_4_ + auVar187._16_4_;
      auVar168._20_4_ = local_2be0._20_4_ + auVar187._20_4_;
      auVar168._24_4_ = local_2be0._24_4_ + auVar187._24_4_;
      fVar99 = auVar187._28_4_;
      auVar168._28_4_ = local_2be0._28_4_ + fVar99;
      fVar86 = local_2c40._0_4_;
      auVar184._0_4_ = auVar130._0_4_ + fVar86;
      fVar93 = local_2c40._4_4_;
      auVar184._4_4_ = auVar130._4_4_ + fVar93;
      fVar94 = local_2c40._8_4_;
      auVar184._8_4_ = auVar130._8_4_ + fVar94;
      fVar95 = local_2c40._12_4_;
      auVar184._12_4_ = auVar130._12_4_ + fVar95;
      fVar96 = local_2c40._16_4_;
      auVar184._16_4_ = auVar130._16_4_ + fVar96;
      fVar97 = local_2c40._20_4_;
      auVar184._20_4_ = auVar130._20_4_ + fVar97;
      fVar98 = local_2c40._24_4_;
      auVar184._24_4_ = auVar130._24_4_ + fVar98;
      fVar113 = local_2c40._28_4_;
      auVar184._28_4_ = auVar130._28_4_ + fVar113;
      auVar27._4_4_ = local_26c0._4_4_ * auVar168._4_4_;
      auVar27._0_4_ = local_26c0._0_4_ * auVar168._0_4_;
      auVar27._8_4_ = local_26c0._8_4_ * auVar168._8_4_;
      auVar27._12_4_ = local_26c0._12_4_ * auVar168._12_4_;
      auVar27._16_4_ = local_26c0._16_4_ * auVar168._16_4_;
      auVar27._20_4_ = local_26c0._20_4_ * auVar168._20_4_;
      auVar27._24_4_ = local_26c0._24_4_ * auVar168._24_4_;
      auVar27._28_4_ = auVar100._28_4_;
      auVar87 = vfmsub231ps_fma(auVar27,local_2c00,auVar184);
      auVar190._0_4_ = auVar184._0_4_ * local_26a0._0_4_;
      auVar190._4_4_ = auVar184._4_4_ * local_26a0._4_4_;
      auVar190._8_4_ = auVar184._8_4_ * local_26a0._8_4_;
      auVar190._12_4_ = auVar184._12_4_ * local_26a0._12_4_;
      auVar190._16_4_ = auVar184._16_4_ * local_26a0._16_4_;
      auVar190._20_4_ = auVar184._20_4_ * local_26a0._20_4_;
      auVar190._28_36_ = auVar171._28_36_;
      auVar190._24_4_ = auVar184._24_4_ * local_26a0._24_4_;
      auVar121 = vfmsub231ps_fma(auVar190._0_32_,local_26c0,auVar136);
      auVar28._4_4_ = auVar136._4_4_ * local_2c00._4_4_;
      auVar28._0_4_ = auVar136._0_4_ * local_2c00._0_4_;
      auVar28._8_4_ = auVar136._8_4_ * local_2c00._8_4_;
      auVar28._12_4_ = auVar136._12_4_ * local_2c00._12_4_;
      auVar28._16_4_ = auVar136._16_4_ * local_2c00._16_4_;
      auVar28._20_4_ = auVar136._20_4_ * local_2c00._20_4_;
      auVar28._24_4_ = auVar136._24_4_ * local_2c00._24_4_;
      auVar28._28_4_ = auVar136._28_4_;
      auVar13 = vfmsub231ps_fma(auVar28,local_26a0,auVar168);
      local_2d40 = *(undefined1 (*) [32])(ray + 0xc0);
      in_ZMM14 = ZEXT3264(local_2d40);
      fVar201 = local_2d40._0_4_;
      fVar204 = local_2d40._4_4_;
      auVar29._4_4_ = fVar204 * auVar13._4_4_;
      auVar29._0_4_ = fVar201 * auVar13._0_4_;
      fVar205 = local_2d40._8_4_;
      auVar29._8_4_ = fVar205 * auVar13._8_4_;
      fVar194 = local_2d40._12_4_;
      auVar29._12_4_ = fVar194 * auVar13._12_4_;
      fVar206 = local_2d40._16_4_;
      auVar29._16_4_ = fVar206 * 0.0;
      fVar207 = local_2d40._20_4_;
      auVar29._20_4_ = fVar207 * 0.0;
      fVar208 = local_2d40._24_4_;
      auVar29._24_4_ = fVar208 * 0.0;
      auVar29._28_4_ = local_26a0._28_4_;
      auVar132 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar121 = vfmadd231ps_fma(auVar29,auVar132,ZEXT1632(auVar121));
      auVar100 = *(undefined1 (*) [32])(ray + 0x80);
      auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar100,ZEXT1632(auVar87));
      in_ZMM13 = ZEXT1664(auVar121);
      local_26e0 = vsubps_avx(local_2be0,auVar140);
      local_2720 = vsubps_avx(local_2c40,auVar163);
      auVar169._0_4_ = local_2be0._0_4_ + auVar140._0_4_;
      auVar169._4_4_ = local_2be0._4_4_ + auVar140._4_4_;
      auVar169._8_4_ = local_2be0._8_4_ + auVar140._8_4_;
      auVar169._12_4_ = local_2be0._12_4_ + auVar140._12_4_;
      auVar169._16_4_ = local_2be0._16_4_ + auVar140._16_4_;
      auVar169._20_4_ = local_2be0._20_4_ + auVar140._20_4_;
      auVar169._24_4_ = local_2be0._24_4_ + auVar140._24_4_;
      auVar169._28_4_ = local_2be0._28_4_ + auVar140._28_4_;
      auVar209._0_4_ = fVar86 + auVar163._0_4_;
      auVar209._4_4_ = fVar93 + auVar163._4_4_;
      auVar209._8_4_ = fVar94 + auVar163._8_4_;
      auVar209._12_4_ = fVar95 + auVar163._12_4_;
      auVar209._16_4_ = fVar96 + auVar163._16_4_;
      auVar209._20_4_ = fVar97 + auVar163._20_4_;
      auVar209._24_4_ = fVar98 + auVar163._24_4_;
      auVar209._28_4_ = fVar113 + auVar163._28_4_;
      fVar115 = local_2720._0_4_;
      fVar191 = local_2720._4_4_;
      auVar30._4_4_ = auVar169._4_4_ * fVar191;
      auVar30._0_4_ = auVar169._0_4_ * fVar115;
      fVar11 = local_2720._8_4_;
      auVar30._8_4_ = auVar169._8_4_ * fVar11;
      fVar150 = local_2720._12_4_;
      auVar30._12_4_ = auVar169._12_4_ * fVar150;
      fVar153 = local_2720._16_4_;
      auVar30._16_4_ = auVar169._16_4_ * fVar153;
      fVar162 = local_2720._20_4_;
      auVar30._20_4_ = auVar169._20_4_ * fVar162;
      fVar174 = local_2720._24_4_;
      auVar30._24_4_ = auVar169._24_4_ * fVar174;
      auVar30._28_4_ = fVar113;
      auVar13 = vfmsub231ps_fma(auVar30,local_26e0,auVar209);
      local_2700 = vsubps_avx(local_2c20,auVar131);
      auVar197 = ZEXT3264(local_2700);
      fVar113 = local_2700._0_4_;
      fVar192 = local_2700._4_4_;
      auVar31._4_4_ = auVar209._4_4_ * fVar192;
      auVar31._0_4_ = auVar209._0_4_ * fVar113;
      fVar12 = local_2700._8_4_;
      auVar31._8_4_ = auVar209._8_4_ * fVar12;
      fVar151 = local_2700._12_4_;
      auVar31._12_4_ = auVar209._12_4_ * fVar151;
      fVar154 = local_2700._16_4_;
      auVar31._16_4_ = auVar209._16_4_ * fVar154;
      fVar172 = local_2700._20_4_;
      auVar31._20_4_ = auVar209._20_4_ * fVar172;
      fVar175 = local_2700._24_4_;
      auVar31._24_4_ = auVar209._24_4_ * fVar175;
      auVar31._28_4_ = auVar209._28_4_;
      auVar180._0_4_ = auVar131._0_4_ + local_2c20._0_4_;
      auVar180._4_4_ = auVar131._4_4_ + local_2c20._4_4_;
      auVar180._8_4_ = auVar131._8_4_ + local_2c20._8_4_;
      auVar180._12_4_ = auVar131._12_4_ + local_2c20._12_4_;
      auVar180._16_4_ = auVar131._16_4_ + local_2c20._16_4_;
      auVar180._20_4_ = auVar131._20_4_ + local_2c20._20_4_;
      auVar180._24_4_ = auVar131._24_4_ + local_2c20._24_4_;
      auVar180._28_4_ = auVar131._28_4_ + local_2c20._28_4_;
      auVar87 = vfmsub231ps_fma(auVar31,local_2720,auVar180);
      fVar117 = local_26e0._0_4_;
      fVar193 = local_26e0._4_4_;
      auVar32._4_4_ = auVar180._4_4_ * fVar193;
      auVar32._0_4_ = auVar180._0_4_ * fVar117;
      fVar139 = local_26e0._8_4_;
      auVar32._8_4_ = auVar180._8_4_ * fVar139;
      fVar152 = local_26e0._12_4_;
      auVar32._12_4_ = auVar180._12_4_ * fVar152;
      fVar155 = local_26e0._16_4_;
      auVar32._16_4_ = auVar180._16_4_ * fVar155;
      fVar173 = local_26e0._20_4_;
      auVar32._20_4_ = auVar180._20_4_ * fVar173;
      fVar176 = local_26e0._24_4_;
      auVar32._24_4_ = auVar180._24_4_ * fVar176;
      auVar32._28_4_ = auVar180._28_4_;
      auVar156 = vfmsub231ps_fma(auVar32,local_2700,auVar169);
      auVar33._4_4_ = fVar204 * auVar156._4_4_;
      auVar33._0_4_ = fVar201 * auVar156._0_4_;
      auVar33._8_4_ = fVar205 * auVar156._8_4_;
      auVar33._12_4_ = fVar194 * auVar156._12_4_;
      auVar33._16_4_ = fVar206 * 0.0;
      auVar33._20_4_ = fVar207 * 0.0;
      auVar33._24_4_ = fVar208 * 0.0;
      auVar33._28_4_ = auVar169._28_4_;
      auVar87 = vfmadd231ps_fma(auVar33,auVar132,ZEXT1632(auVar87));
      auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar100,ZEXT1632(auVar13));
      auVar171 = ZEXT1664(auVar87);
      auVar195 = vsubps_avx(auVar131,auVar104);
      auVar103._0_4_ = auVar131._0_4_ + auVar104._0_4_;
      auVar103._4_4_ = auVar131._4_4_ + auVar104._4_4_;
      auVar103._8_4_ = auVar131._8_4_ + auVar104._8_4_;
      auVar103._12_4_ = auVar131._12_4_ + auVar104._12_4_;
      auVar103._16_4_ = auVar131._16_4_ + auVar104._16_4_;
      auVar103._20_4_ = auVar131._20_4_ + auVar104._20_4_;
      auVar103._24_4_ = auVar131._24_4_ + auVar104._24_4_;
      auVar103._28_4_ = auVar131._28_4_ + auVar104._28_4_;
      auVar104 = vsubps_avx(auVar140,auVar187);
      in_ZMM12 = ZEXT3264(auVar104);
      auVar89._0_4_ = auVar140._0_4_ + auVar187._0_4_;
      auVar89._4_4_ = auVar140._4_4_ + auVar187._4_4_;
      auVar89._8_4_ = auVar140._8_4_ + auVar187._8_4_;
      auVar89._12_4_ = auVar140._12_4_ + auVar187._12_4_;
      auVar89._16_4_ = auVar140._16_4_ + auVar187._16_4_;
      auVar89._20_4_ = auVar140._20_4_ + auVar187._20_4_;
      auVar89._24_4_ = auVar140._24_4_ + auVar187._24_4_;
      auVar89._28_4_ = auVar140._28_4_ + fVar99;
      auVar187 = vsubps_avx(auVar163,auVar130);
      auVar126._0_4_ = auVar163._0_4_ + auVar130._0_4_;
      auVar126._4_4_ = auVar163._4_4_ + auVar130._4_4_;
      auVar126._8_4_ = auVar163._8_4_ + auVar130._8_4_;
      auVar126._12_4_ = auVar163._12_4_ + auVar130._12_4_;
      auVar126._16_4_ = auVar163._16_4_ + auVar130._16_4_;
      auVar126._20_4_ = auVar163._20_4_ + auVar130._20_4_;
      auVar126._24_4_ = auVar163._24_4_ + auVar130._24_4_;
      auVar126._28_4_ = auVar163._28_4_ + auVar130._28_4_;
      auVar34._4_4_ = auVar187._4_4_ * auVar89._4_4_;
      auVar34._0_4_ = auVar187._0_4_ * auVar89._0_4_;
      auVar34._8_4_ = auVar187._8_4_ * auVar89._8_4_;
      auVar34._12_4_ = auVar187._12_4_ * auVar89._12_4_;
      auVar34._16_4_ = auVar187._16_4_ * auVar89._16_4_;
      auVar34._20_4_ = auVar187._20_4_ * auVar89._20_4_;
      auVar34._24_4_ = auVar187._24_4_ * auVar89._24_4_;
      auVar34._28_4_ = fVar99;
      auVar156 = vfmsub231ps_fma(auVar34,auVar104,auVar126);
      auVar35._4_4_ = auVar195._4_4_ * auVar126._4_4_;
      auVar35._0_4_ = auVar195._0_4_ * auVar126._0_4_;
      auVar35._8_4_ = auVar195._8_4_ * auVar126._8_4_;
      auVar35._12_4_ = auVar195._12_4_ * auVar126._12_4_;
      auVar35._16_4_ = auVar195._16_4_ * auVar126._16_4_;
      auVar35._20_4_ = auVar195._20_4_ * auVar126._20_4_;
      auVar35._24_4_ = auVar195._24_4_ * auVar126._24_4_;
      auVar35._28_4_ = auVar126._28_4_;
      auVar13 = vfmsub231ps_fma(auVar35,auVar187,auVar103);
      auVar36._4_4_ = auVar104._4_4_ * auVar103._4_4_;
      auVar36._0_4_ = auVar104._0_4_ * auVar103._0_4_;
      auVar36._8_4_ = auVar104._8_4_ * auVar103._8_4_;
      auVar36._12_4_ = auVar104._12_4_ * auVar103._12_4_;
      auVar36._16_4_ = auVar104._16_4_ * auVar103._16_4_;
      auVar36._20_4_ = auVar104._20_4_ * auVar103._20_4_;
      auVar36._24_4_ = auVar104._24_4_ * auVar103._24_4_;
      auVar36._28_4_ = auVar103._28_4_;
      auVar14 = vfmsub231ps_fma(auVar36,auVar195,auVar89);
      auVar37._4_4_ = fVar204 * auVar14._4_4_;
      auVar37._0_4_ = fVar201 * auVar14._0_4_;
      auVar37._8_4_ = fVar205 * auVar14._8_4_;
      auVar37._12_4_ = fVar194 * auVar14._12_4_;
      auVar37._16_4_ = fVar206 * 0.0;
      auVar37._20_4_ = fVar207 * 0.0;
      auVar37._24_4_ = fVar208 * 0.0;
      auVar37._28_4_ = auVar89._28_4_;
      auVar13 = vfmadd231ps_fma(auVar37,auVar132,ZEXT1632(auVar13));
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar100,ZEXT1632(auVar156));
      auVar156._0_8_ =
           CONCAT44(auVar13._4_4_ + auVar121._4_4_ + auVar87._4_4_,
                    auVar13._0_4_ + auVar121._0_4_ + auVar87._0_4_);
      auVar156._8_4_ = auVar13._8_4_ + auVar121._8_4_ + auVar87._8_4_;
      auVar156._12_4_ = auVar13._12_4_ + auVar121._12_4_ + auVar87._12_4_;
      auVar190 = ZEXT3264(local_27a0);
      auVar130 = vandps_avx(local_27a0,ZEXT1632(auVar156));
      fVar99 = auVar130._0_4_ * 1.1920929e-07;
      fVar112 = auVar130._4_4_ * 1.1920929e-07;
      auVar38._4_4_ = fVar112;
      auVar38._0_4_ = fVar99;
      fVar114 = auVar130._8_4_ * 1.1920929e-07;
      auVar38._8_4_ = fVar114;
      fVar116 = auVar130._12_4_ * 1.1920929e-07;
      auVar38._12_4_ = fVar116;
      fVar118 = auVar130._16_4_ * 1.1920929e-07;
      auVar38._16_4_ = fVar118;
      fVar119 = auVar130._20_4_ * 1.1920929e-07;
      auVar38._20_4_ = fVar119;
      fVar120 = auVar130._24_4_ * 1.1920929e-07;
      auVar38._24_4_ = fVar120;
      auVar38._28_4_ = auVar130._28_4_;
      auVar200 = ZEXT1632(auVar121);
      auVar131 = vminps_avx(auVar200,ZEXT1632(auVar87));
      auVar131 = vminps_avx(auVar131,ZEXT1632(auVar13));
      auVar181._8_4_ = 0x80000000;
      auVar181._0_8_ = 0x8000000080000000;
      auVar181._12_4_ = 0x80000000;
      auVar181._16_4_ = 0x80000000;
      auVar181._20_4_ = 0x80000000;
      auVar181._24_4_ = 0x80000000;
      auVar181._28_4_ = 0x80000000;
      auVar148._0_8_ = CONCAT44(fVar112,fVar99) ^ 0x8000000080000000;
      auVar148._8_4_ = -fVar114;
      auVar148._12_4_ = -fVar116;
      auVar148._16_4_ = -fVar118;
      auVar148._20_4_ = -fVar119;
      auVar148._24_4_ = -fVar120;
      auVar148._28_4_ = auVar130._28_4_ ^ 0x80000000;
      auVar131 = vcmpps_avx(auVar131,auVar148,5);
      auVar140 = vmaxps_avx(auVar200,ZEXT1632(auVar87));
      auVar130 = vmaxps_avx(auVar140,ZEXT1632(auVar13));
      auVar130 = vcmpps_avx(auVar130,auVar38,2);
      auVar163 = vorps_avx(auVar131,auVar130);
      auVar129 = auVar105 & auVar163;
      auVar130 = vandps_avx(auVar163,auVar105);
      if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar129 >> 0x7f,0) != '\0') ||
            (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar129 >> 0xbf,0) != '\0') ||
          (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar129[0x1f] < '\0') {
        local_2780 = ZEXT1632(auVar156);
        local_2740 = auVar130;
        in_ZMM14 = ZEXT3264(local_26e0);
        auVar39._4_4_ = fVar193 * local_26c0._4_4_;
        auVar39._0_4_ = fVar117 * local_26c0._0_4_;
        auVar39._8_4_ = fVar139 * local_26c0._8_4_;
        auVar39._12_4_ = fVar152 * local_26c0._12_4_;
        auVar39._16_4_ = fVar155 * local_26c0._16_4_;
        auVar39._20_4_ = fVar173 * local_26c0._20_4_;
        auVar39._24_4_ = fVar176 * local_26c0._24_4_;
        auVar39._28_4_ = auVar163._28_4_;
        local_2760 = fVar113 * local_2c00._0_4_;
        fStack_275c = fVar192 * local_2c00._4_4_;
        fStack_2758 = fVar12 * local_2c00._8_4_;
        fStack_2754 = fVar151 * local_2c00._12_4_;
        fStack_2750 = fVar154 * local_2c00._16_4_;
        fStack_274c = fVar172 * local_2c00._20_4_;
        uStack_2744 = auVar131._28_4_;
        fStack_2748 = fVar175 * local_2c00._24_4_;
        auVar197 = ZEXT3264(local_2720);
        auVar13 = vfmsub213ps_fma(local_2c00,local_2720,auVar39);
        auVar40._4_4_ = auVar104._4_4_ * fVar191;
        auVar40._0_4_ = auVar104._0_4_ * fVar115;
        auVar40._8_4_ = auVar104._8_4_ * fVar11;
        auVar40._12_4_ = auVar104._12_4_ * fVar150;
        auVar40._16_4_ = auVar104._16_4_ * fVar153;
        auVar40._20_4_ = auVar104._20_4_ * fVar162;
        auVar40._24_4_ = auVar104._24_4_ * fVar174;
        auVar40._28_4_ = uStack_2744;
        auVar41._4_4_ = auVar187._4_4_ * fVar192;
        auVar41._0_4_ = auVar187._0_4_ * fVar113;
        auVar41._8_4_ = auVar187._8_4_ * fVar12;
        auVar41._12_4_ = auVar187._12_4_ * fVar151;
        auVar41._16_4_ = auVar187._16_4_ * fVar154;
        auVar41._20_4_ = auVar187._20_4_ * fVar172;
        auVar41._24_4_ = auVar187._24_4_ * fVar175;
        auVar41._28_4_ = auVar140._28_4_;
        auVar14 = vfmsub213ps_fma(auVar187,local_26e0,auVar40);
        auVar105 = vandps_avx(local_27a0,auVar39);
        auVar131 = vandps_avx(local_27a0,auVar40);
        auVar105 = vcmpps_avx(auVar105,auVar131,1);
        auVar140 = vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar13),auVar105);
        auVar159._0_4_ = auVar195._0_4_ * fVar117;
        auVar159._4_4_ = auVar195._4_4_ * fVar193;
        auVar159._8_4_ = auVar195._8_4_ * fVar139;
        auVar159._12_4_ = auVar195._12_4_ * fVar152;
        auVar159._16_4_ = auVar195._16_4_ * fVar155;
        auVar159._20_4_ = auVar195._20_4_ * fVar173;
        auVar159._24_4_ = auVar195._24_4_ * fVar176;
        auVar159._28_4_ = 0;
        auVar13 = vfmsub213ps_fma(auVar195,local_2720,auVar41);
        local_2c00 = auVar181;
        auVar42._4_4_ = fVar191 * local_26a0._4_4_;
        auVar42._0_4_ = fVar115 * local_26a0._0_4_;
        auVar42._8_4_ = fVar11 * local_26a0._8_4_;
        auVar42._12_4_ = fVar150 * local_26a0._12_4_;
        auVar42._16_4_ = fVar153 * local_26a0._16_4_;
        auVar42._20_4_ = fVar162 * local_26a0._20_4_;
        auVar42._24_4_ = fVar174 * local_26a0._24_4_;
        auVar42._28_4_ = auVar131._28_4_;
        auVar14 = vfmsub213ps_fma(local_26c0,local_2700,auVar42);
        auVar105 = vandps_avx(local_27a0,auVar42);
        auVar131 = vandps_avx(local_27a0,auVar41);
        auVar105 = vcmpps_avx(auVar105,auVar131,1);
        auVar163 = vblendvps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14),auVar105);
        auVar50._4_4_ = fStack_275c;
        auVar50._0_4_ = local_2760;
        auVar50._8_4_ = fStack_2758;
        auVar50._12_4_ = fStack_2754;
        auVar50._16_4_ = fStack_2750;
        auVar50._20_4_ = fStack_274c;
        auVar50._24_4_ = fStack_2748;
        auVar50._28_4_ = uStack_2744;
        auVar13 = vfmsub213ps_fma(local_26a0,local_26e0,auVar50);
        auVar14 = vfmsub213ps_fma(auVar104,local_2700,auVar159);
        in_ZMM12 = ZEXT1664(auVar14);
        auVar105 = vandps_avx(local_27a0,auVar50);
        auVar131 = vandps_avx(local_27a0,auVar159);
        auVar105 = vcmpps_avx(auVar105,auVar131,1);
        afVar10 = (__m256)vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar13),auVar105);
        auVar43._4_4_ = afVar10[1] * fVar204;
        auVar43._0_4_ = afVar10[0] * fVar201;
        auVar43._8_4_ = afVar10[2] * fVar205;
        auVar43._12_4_ = afVar10[3] * fVar194;
        auVar43._16_4_ = afVar10[4] * fVar206;
        auVar43._20_4_ = afVar10[5] * fVar207;
        auVar43._24_4_ = afVar10[6] * fVar208;
        auVar43._28_4_ = auVar105._28_4_;
        auVar13 = vfmadd213ps_fma(auVar132,auVar163,auVar43);
        auVar13 = vfmadd213ps_fma(auVar100,auVar140,ZEXT1632(auVar13));
        fVar99 = auVar13._0_4_ + auVar13._0_4_;
        fVar113 = auVar13._4_4_ + auVar13._4_4_;
        fVar115 = auVar13._8_4_ + auVar13._8_4_;
        fVar117 = auVar13._12_4_ + auVar13._12_4_;
        auVar104 = ZEXT1632(CONCAT412(fVar117,CONCAT48(fVar115,CONCAT44(fVar113,fVar99))));
        auVar160._0_4_ = afVar10[0] * fVar86;
        auVar160._4_4_ = afVar10[1] * fVar93;
        auVar160._8_4_ = afVar10[2] * fVar94;
        auVar160._12_4_ = afVar10[3] * fVar95;
        auVar160._16_4_ = afVar10[4] * fVar96;
        auVar160._20_4_ = afVar10[5] * fVar97;
        auVar160._24_4_ = afVar10[6] * fVar98;
        auVar160._28_4_ = 0;
        auVar13 = vfmadd213ps_fma(local_2be0,auVar163,auVar160);
        auVar14 = vfmadd213ps_fma(local_2c20,auVar140,ZEXT1632(auVar13));
        auVar105 = vrcpps_avx(auVar104);
        auVar188._8_4_ = 0x3f800000;
        auVar188._0_8_ = 0x3f8000003f800000;
        auVar188._12_4_ = 0x3f800000;
        auVar188._16_4_ = 0x3f800000;
        auVar188._20_4_ = 0x3f800000;
        auVar188._24_4_ = 0x3f800000;
        auVar188._28_4_ = 0x3f800000;
        auVar13 = vfnmadd213ps_fma(auVar105,auVar104,auVar188);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar105,auVar105);
        auVar131 = ZEXT1632(CONCAT412(auVar13._12_4_ * (auVar14._12_4_ + auVar14._12_4_),
                                      CONCAT48(auVar13._8_4_ * (auVar14._8_4_ + auVar14._8_4_),
                                               CONCAT44(auVar13._4_4_ *
                                                        (auVar14._4_4_ + auVar14._4_4_),
                                                        auVar13._0_4_ *
                                                        (auVar14._0_4_ + auVar14._0_4_)))));
        auVar105 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar131,2);
        auVar100 = vcmpps_avx(auVar131,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar105 = vandps_avx(auVar100,auVar105);
        auVar185._0_8_ = CONCAT44(fVar113,fVar99) ^ 0x8000000080000000;
        auVar185._8_4_ = -fVar115;
        auVar185._12_4_ = -fVar117;
        auVar185._16_4_ = 0x80000000;
        auVar185._20_4_ = 0x80000000;
        auVar185._24_4_ = 0x80000000;
        auVar185._28_4_ = 0x80000000;
        auVar100 = vcmpps_avx(auVar185,auVar104,4);
        auVar105 = vandps_avx(auVar100,auVar105);
        auVar105 = vpslld_avx2(auVar105,0x1f);
        auVar100 = vpsrad_avx2(auVar105,0x1f);
        auVar105 = auVar130 & auVar100;
        auVar130 = vandps_avx(auVar100,auVar130);
        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar105 >> 0x7f,0) != '\0') ||
              (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar105 >> 0xbf,0) != '\0') ||
            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar105[0x1f] < '\0') {
          _local_27c0 = auVar200;
          _local_27e0 = ZEXT1632(auVar87);
          local_2780._8_8_ = auVar156._8_8_;
          local_2800 = auVar156._0_8_;
          uStack_27f8 = local_2780._8_8_;
          uStack_27f0 = 0;
          uStack_27e8 = 0;
          local_2820 = auVar131;
          local_2840 = auVar140;
          local_2860 = auVar163;
          local_2880.i[0] = (int)afVar10[0];
          local_2880.i[1] = (int)afVar10[1];
          local_2880.i[2] = (int)afVar10[2];
          local_2880.i[3] = (int)afVar10[3];
          local_2880.i[4] = (int)afVar10[4];
          local_2880.i[5] = (int)afVar10[5];
          local_2880.i[6] = (int)afVar10[6];
          local_2880.i[7] = (int)afVar10[7];
        }
      }
      uVar74 = *(uint *)((long)&local_2a70 + lVar77 * 4);
      pGVar7 = *(Geometry **)((long)&pRVar76->flags + (ulong)uVar74 * 8);
      uVar84 = pGVar7->mask;
      auVar90._4_4_ = uVar84;
      auVar90._0_4_ = uVar84;
      auVar90._8_4_ = uVar84;
      auVar90._12_4_ = uVar84;
      auVar90._16_4_ = uVar84;
      auVar90._20_4_ = uVar84;
      auVar90._24_4_ = uVar84;
      auVar90._28_4_ = uVar84;
      auVar105 = vpand_avx2(auVar90,*(undefined1 (*) [32])(ray + 0x120));
      auVar131 = vpcmpeqd_avx2(auVar105,_DAT_01f7b000);
      auVar100 = auVar130 & ~auVar131;
      unaff_R12 = local_2dc0;
      auVar105 = local_2d20;
      if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar100 >> 0x7f,0) != '\0') ||
            (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar100 >> 0xbf,0) != '\0') ||
          (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar100[0x1f] < '\0') {
        auVar105 = vandnps_avx(auVar131,auVar130);
        pRVar76 = context->args;
        if ((pRVar76->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          local_2d40._0_8_ = lVar77;
          local_2da0._8_24_ = auVar132._8_24_;
          auVar49._8_8_ = uStack_27f8;
          auVar49._0_8_ = local_2800;
          auVar49._16_8_ = uStack_27f0;
          auVar49._24_8_ = uStack_27e8;
          auVar100 = vrcpps_avx(auVar49);
          auVar132 = vandps_avx(local_27a0,auVar49);
          auVar137._8_4_ = 0x3f800000;
          auVar137._0_8_ = 0x3f8000003f800000;
          auVar137._12_4_ = 0x3f800000;
          auVar137._16_4_ = 0x3f800000;
          auVar137._20_4_ = 0x3f800000;
          auVar137._24_4_ = 0x3f800000;
          auVar137._28_4_ = 0x3f800000;
          auVar13 = vfnmadd213ps_fma(auVar100,auVar49,auVar137);
          auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar100,auVar100);
          auVar91._8_4_ = 0x219392ef;
          auVar91._0_8_ = 0x219392ef219392ef;
          auVar91._12_4_ = 0x219392ef;
          auVar91._16_4_ = 0x219392ef;
          auVar91._20_4_ = 0x219392ef;
          auVar91._24_4_ = 0x219392ef;
          auVar91._28_4_ = 0x219392ef;
          auVar100 = vcmpps_avx(auVar132,auVar91,5);
          auVar100 = vandps_avx(auVar100,ZEXT1632(auVar13));
          auVar44._4_4_ = auVar100._4_4_ * (float)local_27c0._4_4_;
          auVar44._0_4_ = auVar100._0_4_ * (float)local_27c0._0_4_;
          auVar44._8_4_ = auVar100._8_4_ * fStack_27b8;
          auVar44._12_4_ = auVar100._12_4_ * fStack_27b4;
          auVar44._16_4_ = auVar100._16_4_ * fStack_27b0;
          auVar44._20_4_ = auVar100._20_4_ * fStack_27ac;
          auVar44._24_4_ = auVar100._24_4_ * fStack_27a8;
          auVar44._28_4_ = auVar132._28_4_;
          local_2b20 = vminps_avx(auVar44,auVar137);
          auVar45._4_4_ = auVar100._4_4_ * (float)local_27e0._4_4_;
          auVar45._0_4_ = auVar100._0_4_ * (float)local_27e0._0_4_;
          auVar45._8_4_ = auVar100._8_4_ * fStack_27d8;
          auVar45._12_4_ = auVar100._12_4_ * fStack_27d4;
          auVar45._16_4_ = auVar100._16_4_ * fStack_27d0;
          auVar45._20_4_ = auVar100._20_4_ * fStack_27cc;
          auVar45._24_4_ = auVar100._24_4_ * fStack_27c8;
          auVar45._28_4_ = auVar100._28_4_;
          local_2b40 = vminps_avx(auVar45,auVar137);
          local_2bc0._0_8_ = local_2840._0_8_;
          local_2bc0._8_8_ = local_2840._8_8_;
          local_2bc0._16_8_ = local_2840._16_8_;
          local_2bc0._24_8_ = local_2840._24_8_;
          local_2bc0._32_8_ = local_2860._0_8_;
          local_2bc0._40_8_ = local_2860._8_8_;
          local_2bc0._48_8_ = local_2860._16_8_;
          local_2bc0._56_8_ = local_2860._24_8_;
          local_2bc0.field_0.z.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_2880;
          local_2b60 = local_2820._0_8_;
          uStack_2b58 = local_2820._8_8_;
          uStack_2b50 = local_2820._16_8_;
          uStack_2b48 = local_2820._24_8_;
          local_2d80.geometryUserPtr = local_2680;
          local_2d80.valid = (int *)local_2ce0;
          local_2d80.context = (RTCRayQueryContext *)local_2660;
          local_2d80.ray = (RTCRayN *)&local_2640;
          local_2c20._0_8_ = pGVar7;
          local_2c40._0_4_ = *(undefined4 *)((long)&local_2a80 + lVar77 * 4);
          auVar171 = ZEXT1664(auVar87);
          auVar190 = ZEXT1664(local_27a0._0_16_);
          auVar197 = ZEXT1664(auVar197._0_16_);
          in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
          in_ZMM13 = ZEXT1664(auVar121);
          in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
          local_2be0 = auVar105;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
          ::
          _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                      *)&local_2d80,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                      *)&local_2bc0.field_0);
          local_2b20._4_4_ = local_2c40._0_4_;
          local_2b20._0_4_ = local_2c40._0_4_;
          local_2b20._8_4_ = local_2c40._0_4_;
          local_2b20._12_4_ = local_2c40._0_4_;
          local_2b20._16_4_ = local_2c40._0_4_;
          local_2b20._20_4_ = local_2c40._0_4_;
          local_2b20._24_4_ = local_2c40._0_4_;
          local_2b20._28_4_ = local_2c40._0_4_;
          local_2bc0._0_8_ = CONCAT44(local_2ce0[1],local_2ce0[0]);
          local_2bc0._8_8_ = CONCAT44(local_2ce0[3],local_2ce0[2]);
          local_2bc0._16_8_ = CONCAT44(fStack_2ccc,fStack_2cd0);
          local_2bc0._24_8_ = CONCAT44(fStack_2cc4,fStack_2cc8);
          local_2bc0._32_8_ = CONCAT44(local_2cc0[1],local_2cc0[0]);
          local_2bc0._40_8_ = CONCAT44(local_2cc0[3],local_2cc0[2]);
          local_2bc0._48_8_ = CONCAT44(fStack_2cac,fStack_2cb0);
          local_2bc0._56_8_ = ZEXT48((uint)fStack_2ca8);
          local_2bc0._68_4_ = local_2ca0[1];
          local_2bc0._64_4_ = local_2ca0[0];
          local_2bc0._72_4_ = local_2ca0[2];
          local_2bc0._76_4_ = local_2ca0[3];
          local_2bc0._80_4_ = fStack_2c90;
          local_2bc0._84_4_ = fStack_2c8c;
          local_2bc0._88_4_ = fStack_2c88;
          local_2bc0._92_4_ = uStack_2c84;
          local_2b60 = local_2640;
          uStack_2b58 = uStack_2638;
          uStack_2b50 = uStack_2630;
          uStack_2b48 = uStack_2628;
          local_2b00 = uVar74;
          uStack_2afc = uVar74;
          uStack_2af8 = uVar74;
          uStack_2af4 = uVar74;
          uStack_2af0 = uVar74;
          uStack_2aec = uVar74;
          uStack_2ae8 = uVar74;
          uStack_2ae4 = uVar74;
          auVar100 = vpcmpeqd_avx2(local_2b20,local_2b20);
          uStack_2adc = context->user->instID[0];
          local_2ae0 = uStack_2adc;
          uStack_2ad8 = uStack_2adc;
          uStack_2ad4 = uStack_2adc;
          uStack_2ad0 = uStack_2adc;
          uStack_2acc = uStack_2adc;
          uStack_2ac8 = uStack_2adc;
          uStack_2ac4 = uStack_2adc;
          uStack_2abc = context->user->instPrimID[0];
          local_2ac0 = uStack_2abc;
          uStack_2ab8 = uStack_2abc;
          uStack_2ab4 = uStack_2abc;
          uStack_2ab0 = uStack_2abc;
          uStack_2aac = uStack_2abc;
          uStack_2aa8 = uStack_2abc;
          uStack_2aa4 = uStack_2abc;
          local_2c40 = *(undefined1 (*) [32])(ray + 0x100);
          auVar132 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x100),local_2680,local_2be0);
          *(undefined1 (*) [32])(ray + 0x100) = auVar132;
          local_2aa0 = local_2be0;
          local_2d80.geometryUserPtr = (void *)*(undefined8 *)(local_2c20._0_8_ + 0x18);
          local_2d80.valid = (int *)local_2aa0;
          local_2d80.context = context->user;
          local_2d80.ray = (RTCRayN *)ray;
          local_2d80.hit = (RTCHitN *)&local_2bc0;
          local_2d80.N = 8;
          if (*(code **)(local_2c20._0_8_ + 0x48) != (code *)0x0) {
            auVar171 = ZEXT1664(auVar171._0_16_);
            auVar190 = ZEXT1664(auVar190._0_16_);
            auVar197 = ZEXT1664(auVar197._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            (**(code **)(local_2c20._0_8_ + 0x48))(&local_2d80);
            auVar111._8_56_ = extraout_var;
            auVar111._0_8_ = extraout_XMM1_Qa;
            auVar100 = vpcmpeqd_avx2(auVar111._0_32_,auVar111._0_32_);
          }
          unaff_R12 = local_2dc0;
          auVar105 = vpcmpeqd_avx2(local_2aa0,_DAT_01f7b000);
          auVar132 = auVar100 & ~auVar105;
          if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar132 >> 0x7f,0) == '\0') &&
                (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar132 >> 0xbf,0) == '\0') &&
              (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar132[0x1f]) {
            auVar105 = auVar105 ^ auVar100;
            lVar77 = local_2d40._0_8_;
          }
          else {
            p_Var9 = context->args->filter;
            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(local_2c20._0_8_ + 0x3e) & 0x40) != 0)
                ))) {
              auVar171 = ZEXT1664(auVar171._0_16_);
              auVar190 = ZEXT1664(auVar190._0_16_);
              auVar197 = ZEXT1664(auVar197._0_16_);
              in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              (*p_Var9)(&local_2d80);
            }
            auVar132 = vpcmpeqd_avx2(local_2aa0,_DAT_01f7b000);
            auVar105 = auVar132 ^ _DAT_01f7b020;
            auVar108._8_4_ = 0xff800000;
            auVar108._0_8_ = 0xff800000ff800000;
            auVar108._12_4_ = 0xff800000;
            auVar108._16_4_ = 0xff800000;
            auVar108._20_4_ = 0xff800000;
            auVar108._24_4_ = 0xff800000;
            auVar108._28_4_ = 0xff800000;
            auVar132 = vblendvps_avx(auVar108,*(undefined1 (*) [32])(local_2d80.ray + 0x100),
                                     auVar132);
            *(undefined1 (*) [32])(local_2d80.ray + 0x100) = auVar132;
            lVar77 = local_2d40._0_8_;
          }
          RVar4 = (RTCIntersectArguments)
                  vblendvps_avx(local_2c40,(undefined1  [32])*local_2d48,auVar105);
          *local_2d48 = RVar4;
          pRVar76 = local_2d48;
          uVar82 = local_2db8;
        }
        auVar105 = vandnps_avx(auVar105,local_2d20);
      }
      lVar77 = lVar77 + 1;
    } while ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                  (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                SUB321(auVar105 >> 0x7f,0) != '\0') ||
               (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              SUB321(auVar105 >> 0xbf,0) != '\0') ||
             (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             auVar105[0x1f] < '\0');
    auVar132 = local_2c60;
    auVar110 = ZEXT3264(local_2c60);
    auVar100 = vandps_avx(auVar105,local_2c60);
    unaff_R12 = (RTCIntersectArguments *)((long)&unaff_R12->flags + 1);
    auVar105 = local_2c60 & auVar105;
    local_2c60 = auVar100;
  } while ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              SUB321(auVar105 >> 0x7f,0) != '\0') ||
             (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            SUB321(auVar105 >> 0xbf,0) != '\0') ||
           (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           auVar105[0x1f] < '\0');
  auVar132 = vpcmpeqd_avx2(auVar132,auVar132);
  auVar92._0_4_ = local_2c60._0_4_ ^ auVar132._0_4_;
  auVar92._4_4_ = local_2c60._4_4_ ^ auVar132._4_4_;
  auVar92._8_4_ = local_2c60._8_4_ ^ auVar132._8_4_;
  auVar92._12_4_ = local_2c60._12_4_ ^ auVar132._12_4_;
  auVar92._16_4_ = local_2c60._16_4_ ^ auVar132._16_4_;
  auVar92._20_4_ = local_2c60._20_4_ ^ auVar132._20_4_;
  auVar92._24_4_ = local_2c60._24_4_ ^ auVar132._24_4_;
  auVar92._28_4_ = local_2c60._28_4_ ^ auVar132._28_4_;
  local_2c80 = vorps_avx(auVar92,local_2c80);
  auVar132 = auVar132 & ~local_2c80;
  if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar132 >> 0x7f,0) == '\0') &&
        (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar132 >> 0xbf,0) == '\0') &&
      (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar132[0x1f])
  goto LAB_015bf081;
  auVar128._8_4_ = 0xff800000;
  auVar128._0_8_ = 0xff800000ff800000;
  auVar128._12_4_ = 0xff800000;
  auVar128._16_4_ = 0xff800000;
  auVar128._20_4_ = 0xff800000;
  auVar128._24_4_ = 0xff800000;
  auVar128._28_4_ = 0xff800000;
  local_28c0 = vblendvps_avx(local_28c0,auVar128,local_2c80);
  goto LAB_015bdf71;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }